

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  size_t k;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  byte bVar42;
  byte bVar43;
  uint uVar44;
  int iVar45;
  ulong uVar46;
  long lVar47;
  byte bVar48;
  long lVar49;
  long lVar50;
  float *pfVar51;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ulong uVar52;
  long lVar53;
  ulong *puVar54;
  byte bVar55;
  long lVar56;
  undefined1 (*pauVar57) [32];
  NodeRef root;
  ulong uVar58;
  undefined4 uVar59;
  bool bVar60;
  ulong uVar61;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar62 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar65 [16];
  undefined1 auVar90 [32];
  undefined1 auVar92 [16];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [36];
  undefined1 auVar103 [64];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  int iVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 in_ZMM2 [64];
  undefined1 auVar118 [36];
  undefined1 auVar111 [64];
  undefined1 auVar119 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined4 uVar144;
  undefined4 uVar145;
  undefined1 in_ZMM12 [64];
  undefined1 auVar146 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar147 [64];
  undefined1 auVar149 [36];
  undefined1 auVar148 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar150 [64];
  undefined1 auVar152 [36];
  undefined1 auVar151 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar156 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar157 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [64];
  undefined1 auVar160 [16];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  vfloat<8> lower_x;
  TravRayK<8,_false> tray;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5fb9;
  long local_5fb8;
  uint local_5fb0;
  uint local_5fac;
  ulong *local_5fa8;
  long local_5fa0;
  RayK<8> *local_5f98;
  ulong local_5f90;
  undefined4 local_5f84;
  RTCFilterFunctionNArguments local_5f80;
  undefined1 local_5f50 [16];
  undefined1 local_5f40 [16];
  BVH *local_5f30;
  undefined1 (*local_5f28) [32];
  undefined1 local_5f20 [32];
  undefined1 local_5f00 [32];
  undefined1 local_5ee0 [32];
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [8];
  float fStack_5e98;
  float fStack_5e94;
  float fStack_5e90;
  float fStack_5e8c;
  float fStack_5e88;
  float fStack_5e84;
  Intersectors *local_5e68;
  long local_5e60;
  long local_5e58;
  long local_5e50;
  ulong local_5e48;
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  int local_5d80;
  int iStack_5d7c;
  int iStack_5d78;
  int iStack_5d74;
  int iStack_5d70;
  int iStack_5d6c;
  int iStack_5d68;
  int iStack_5d64;
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  RTCHitN local_5ce0 [32];
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  uint local_5c00;
  uint uStack_5bfc;
  uint uStack_5bf8;
  uint uStack_5bf4;
  uint uStack_5bf0;
  uint uStack_5bec;
  uint uStack_5be8;
  uint uStack_5be4;
  uint local_5be0;
  uint uStack_5bdc;
  uint uStack_5bd8;
  uint uStack_5bd4;
  uint uStack_5bd0;
  uint uStack_5bcc;
  uint uStack_5bc8;
  uint uStack_5bc4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5bc0;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  undefined4 uStack_5a84;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  undefined4 uStack_5a64;
  undefined1 local_5a60 [32];
  int local_5a40;
  int iStack_5a3c;
  int iStack_5a38;
  int iStack_5a34;
  int iStack_5a30;
  int iStack_5a2c;
  int iStack_5a28;
  int iStack_5a24;
  uint local_5a20;
  uint uStack_5a1c;
  uint uStack_5a18;
  uint uStack_5a14;
  uint uStack_5a10;
  uint uStack_5a0c;
  uint uStack_5a08;
  uint uStack_5a04;
  uint local_5a00;
  uint uStack_59fc;
  uint uStack_59f8;
  uint uStack_59f4;
  uint uStack_59f0;
  uint uStack_59ec;
  uint uStack_59e8;
  uint uStack_59e4;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 local_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 local_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 local_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 local_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 local_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 local_58b0;
  undefined8 uStack_58a8;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar120 [32];
  
  local_5f30 = (BVH *)This->ptr;
  if ((local_5f30->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar68 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar62 = ZEXT816(0) << 0x40;
      uVar61 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar62),5);
      uVar58 = vpcmpeqd_avx512vl(auVar68,(undefined1  [32])valid_i->field_0);
      uVar61 = uVar61 & uVar58;
      bVar43 = (byte)uVar61;
      if (bVar43 != 0) {
        local_5bc0._0_4_ = *(float *)ray;
        local_5bc0._4_4_ = *(float *)(ray + 4);
        local_5bc0._8_4_ = *(float *)(ray + 8);
        local_5bc0._12_4_ = *(float *)(ray + 0xc);
        local_5bc0._16_4_ = *(float *)(ray + 0x10);
        local_5bc0._20_4_ = *(float *)(ray + 0x14);
        local_5bc0._24_4_ = *(float *)(ray + 0x18);
        local_5bc0._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5bc0._32_4_ = *(float *)(ray + 0x20);
        local_5bc0._36_4_ = *(float *)(ray + 0x24);
        local_5bc0._40_4_ = *(float *)(ray + 0x28);
        local_5bc0._44_4_ = *(float *)(ray + 0x2c);
        local_5bc0._48_4_ = *(float *)(ray + 0x30);
        local_5bc0._52_4_ = *(float *)(ray + 0x34);
        local_5bc0._56_4_ = *(float *)(ray + 0x38);
        local_5bc0._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5bc0._64_4_ = *(float *)(ray + 0x40);
        local_5bc0._68_4_ = *(float *)(ray + 0x44);
        local_5bc0._72_4_ = *(float *)(ray + 0x48);
        local_5bc0._76_4_ = *(float *)(ray + 0x4c);
        local_5bc0._80_4_ = *(float *)(ray + 0x50);
        local_5bc0._84_4_ = *(float *)(ray + 0x54);
        local_5bc0._88_4_ = *(float *)(ray + 0x58);
        local_5bc0._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5b60 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b40 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5b20 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar84._8_4_ = 0x7fffffff;
        auVar84._0_8_ = 0x7fffffff7fffffff;
        auVar84._12_4_ = 0x7fffffff;
        auVar84._16_4_ = 0x7fffffff;
        auVar84._20_4_ = 0x7fffffff;
        auVar84._24_4_ = 0x7fffffff;
        auVar84._28_4_ = 0x7fffffff;
        auVar68 = vandps_avx(auVar84,local_5b60);
        auVar66._8_4_ = 0x219392ef;
        auVar66._0_8_ = 0x219392ef219392ef;
        auVar66._12_4_ = 0x219392ef;
        auVar66._16_4_ = 0x219392ef;
        auVar66._20_4_ = 0x219392ef;
        auVar66._24_4_ = 0x219392ef;
        auVar66._28_4_ = 0x219392ef;
        uVar58 = vcmpps_avx512vl(auVar68,auVar66,1);
        bVar60 = (bool)((byte)uVar58 & 1);
        auVar67._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._0_4_;
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._4_4_;
        bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._8_4_;
        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar67._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._12_4_;
        bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar67._16_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._16_4_;
        bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar67._20_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._20_4_;
        bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar67._24_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._24_4_;
        bVar60 = SUB81(uVar58 >> 7,0);
        auVar67._28_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b60._28_4_;
        auVar68 = vandps_avx(auVar84,local_5b40);
        uVar58 = vcmpps_avx512vl(auVar68,auVar66,1);
        bVar60 = (bool)((byte)uVar58 & 1);
        auVar69._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._0_4_;
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar69._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._4_4_;
        bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar69._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._8_4_;
        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar69._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._12_4_;
        bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar69._16_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._16_4_;
        bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar69._20_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._20_4_;
        bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar69._24_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._24_4_;
        bVar60 = SUB81(uVar58 >> 7,0);
        auVar69._28_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b40._28_4_;
        auVar68 = vandps_avx(auVar84,local_5b20);
        uVar58 = vcmpps_avx512vl(auVar68,auVar66,1);
        bVar60 = (bool)((byte)uVar58 & 1);
        auVar68._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._0_4_;
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._4_4_;
        bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._8_4_;
        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar68._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._12_4_;
        bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar68._16_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._16_4_;
        bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar68._20_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._20_4_;
        bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar68._24_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._24_4_;
        bVar60 = SUB81(uVar58 >> 7,0);
        auVar68._28_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * local_5b20._28_4_;
        auVar70._8_4_ = 0x3f800000;
        auVar70._0_8_ = &DAT_3f8000003f800000;
        auVar70._12_4_ = 0x3f800000;
        auVar70._16_4_ = 0x3f800000;
        auVar70._20_4_ = 0x3f800000;
        auVar70._24_4_ = 0x3f800000;
        auVar70._28_4_ = 0x3f800000;
        auVar66 = vrcp14ps_avx512vl(auVar67);
        auVar65 = vfnmadd213ps_fma(auVar67,auVar66,auVar70);
        auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar66,auVar66);
        auVar67 = vrcp14ps_avx512vl(auVar69);
        auVar64 = vfnmadd213ps_fma(auVar69,auVar67,auVar70);
        auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar67,auVar67);
        auVar67 = vrcp14ps_avx512vl(auVar68);
        auVar63 = vfnmadd213ps_fma(auVar68,auVar67,auVar70);
        local_5b00 = ZEXT1632(auVar65);
        local_5ae0 = ZEXT1632(auVar64);
        auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar67,auVar67);
        local_5ac0 = ZEXT1632(auVar63);
        local_5a60._4_4_ = *(float *)(ray + 0x44) * auVar63._4_4_;
        local_5a60._0_4_ = *(float *)(ray + 0x40) * auVar63._0_4_;
        local_5a60._8_4_ = *(float *)(ray + 0x48) * auVar63._8_4_;
        local_5a60._12_4_ = *(float *)(ray + 0x4c) * auVar63._12_4_;
        local_5a60._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_5a60._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_5a60._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_5a60._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_5aa0 = *(float *)ray * auVar65._0_4_;
        fStack_5a9c = *(float *)(ray + 4) * auVar65._4_4_;
        fStack_5a98 = *(float *)(ray + 8) * auVar65._8_4_;
        fStack_5a94 = *(float *)(ray + 0xc) * auVar65._12_4_;
        fStack_5a90 = *(float *)(ray + 0x10) * 0.0;
        fStack_5a8c = *(float *)(ray + 0x14) * 0.0;
        fStack_5a88 = *(float *)(ray + 0x18) * 0.0;
        uStack_5a84 = *(undefined4 *)(ray + 0x1c);
        local_5a80 = *(float *)(ray + 0x20) * auVar64._0_4_;
        fStack_5a7c = *(float *)(ray + 0x24) * auVar64._4_4_;
        fStack_5a78 = *(float *)(ray + 0x28) * auVar64._8_4_;
        fStack_5a74 = *(float *)(ray + 0x2c) * auVar64._12_4_;
        fStack_5a70 = *(float *)(ray + 0x30) * 0.0;
        fStack_5a6c = *(float *)(ray + 0x34) * 0.0;
        fStack_5a68 = *(float *)(ray + 0x38) * 0.0;
        uStack_5a64 = *(undefined4 *)(ray + 0x3c);
        uVar58 = vcmpps_avx512vl(ZEXT1632(auVar65),ZEXT1632(auVar62),1);
        auVar68 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5a40 = (uint)((byte)uVar58 & 1) * auVar68._0_4_;
        iStack_5a3c = (uint)((byte)(uVar58 >> 1) & 1) * auVar68._4_4_;
        iStack_5a38 = (uint)((byte)(uVar58 >> 2) & 1) * auVar68._8_4_;
        iStack_5a34 = (uint)((byte)(uVar58 >> 3) & 1) * auVar68._12_4_;
        iStack_5a30 = (uint)((byte)(uVar58 >> 4) & 1) * auVar68._16_4_;
        iStack_5a2c = (uint)((byte)(uVar58 >> 5) & 1) * auVar68._20_4_;
        iStack_5a28 = (uint)((byte)(uVar58 >> 6) & 1) * auVar68._24_4_;
        iStack_5a24 = (uint)(byte)(uVar58 >> 7) * auVar68._28_4_;
        auVar67 = ZEXT1632(auVar62);
        uVar58 = vcmpps_avx512vl(ZEXT1632(auVar64),auVar67,5);
        auVar68 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar60 = (bool)((byte)uVar58 & 1);
        bVar11 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar17 = SUB81(uVar58 >> 7,0);
        local_5a20 = (uint)bVar60 * auVar68._0_4_ | (uint)!bVar60 * 0x60;
        uStack_5a1c = (uint)bVar11 * auVar68._4_4_ | (uint)!bVar11 * 0x60;
        uStack_5a18 = (uint)bVar12 * auVar68._8_4_ | (uint)!bVar12 * 0x60;
        uStack_5a14 = (uint)bVar13 * auVar68._12_4_ | (uint)!bVar13 * 0x60;
        uStack_5a10 = (uint)bVar14 * auVar68._16_4_ | (uint)!bVar14 * 0x60;
        uStack_5a0c = (uint)bVar15 * auVar68._20_4_ | (uint)!bVar15 * 0x60;
        uStack_5a08 = (uint)bVar16 * auVar68._24_4_ | (uint)!bVar16 * 0x60;
        uStack_5a04 = (uint)bVar17 * auVar68._28_4_ | (uint)!bVar17 * 0x60;
        uVar58 = vcmpps_avx512vl(ZEXT1632(auVar63),auVar67,5);
        auVar68 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar60 = (bool)((byte)uVar58 & 1);
        bVar11 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar17 = SUB81(uVar58 >> 7,0);
        local_5a00 = (uint)bVar60 * auVar68._0_4_ | (uint)!bVar60 * 0xa0;
        uStack_59fc = (uint)bVar11 * auVar68._4_4_ | (uint)!bVar11 * 0xa0;
        uStack_59f8 = (uint)bVar12 * auVar68._8_4_ | (uint)!bVar12 * 0xa0;
        uStack_59f4 = (uint)bVar13 * auVar68._12_4_ | (uint)!bVar13 * 0xa0;
        uStack_59f0 = (uint)bVar14 * auVar68._16_4_ | (uint)!bVar14 * 0xa0;
        uStack_59ec = (uint)bVar15 * auVar68._20_4_ | (uint)!bVar15 * 0xa0;
        uStack_59e8 = (uint)bVar16 * auVar68._24_4_ | (uint)!bVar16 * 0xa0;
        uStack_59e4 = (uint)bVar17 * auVar68._28_4_ | (uint)!bVar17 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar154 = ZEXT3264(local_4680);
        auVar68 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar67);
        local_59e0._0_4_ =
             (uint)(bVar43 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar43 & 1) * local_4680._0_4_;
        bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
        local_59e0._4_4_ = (uint)bVar60 * auVar68._4_4_ | (uint)!bVar60 * local_4680._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        local_59e0._8_4_ = (uint)bVar60 * auVar68._8_4_ | (uint)!bVar60 * local_4680._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        local_59e0._12_4_ = (uint)bVar60 * auVar68._12_4_ | (uint)!bVar60 * local_4680._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        local_59e0._16_4_ = (uint)bVar60 * auVar68._16_4_ | (uint)!bVar60 * local_4680._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        local_59e0._20_4_ = (uint)bVar60 * auVar68._20_4_ | (uint)!bVar60 * local_4680._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        local_59e0._24_4_ = (uint)bVar60 * auVar68._24_4_ | (uint)!bVar60 * local_4680._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        local_59e0._28_4_ = (uint)bVar60 * auVar68._28_4_ | (uint)!bVar60 * local_4680._28_4_;
        local_5f84 = (undefined4)uVar61;
        auVar68 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar67);
        bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar61 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar61 >> 6) & 1);
        bVar16 = SUB81(uVar61 >> 7,0);
        local_59c0._4_4_ = (uint)bVar60 * auVar68._4_4_ | (uint)!bVar60 * -0x800000;
        local_59c0._0_4_ =
             (uint)(bVar43 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar43 & 1) * -0x800000;
        local_59c0._8_4_ = (uint)bVar11 * auVar68._8_4_ | (uint)!bVar11 * -0x800000;
        local_59c0._12_4_ = (uint)bVar12 * auVar68._12_4_ | (uint)!bVar12 * -0x800000;
        local_59c0._16_4_ = (uint)bVar13 * auVar68._16_4_ | (uint)!bVar13 * -0x800000;
        local_59c0._20_4_ = (uint)bVar14 * auVar68._20_4_ | (uint)!bVar14 * -0x800000;
        local_59c0._24_4_ = (uint)bVar15 * auVar68._24_4_ | (uint)!bVar15 * -0x800000;
        local_59c0._28_4_ = (uint)bVar16 * auVar68._28_4_ | (uint)!bVar16 * -0x800000;
        bVar43 = ~bVar43;
        local_5e68 = This;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar61 = 7;
        }
        else {
          uVar61 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f98 = ray + 0x100;
        puVar54 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar57 = (undefined1 (*) [32])local_4640;
        local_5808 = (local_5f30->root).ptr;
        local_4660 = local_59e0;
        local_5f28 = (undefined1 (*) [32])&local_5c00;
        auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar155 = ZEXT3264(auVar68);
        auVar62 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar156 = ZEXT1664(auVar62);
        auVar62 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        auVar157 = ZEXT1664(auVar62);
        local_5f90 = uVar61;
        do {
          pauVar57 = pauVar57 + -1;
          root.ptr = puVar54[-1];
          puVar54 = puVar54 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_0088c27d:
            iVar45 = 3;
          }
          else {
            _local_5ea0 = *pauVar57;
            uVar58 = vcmpps_avx512vl(_local_5ea0,local_59c0,1);
            if ((char)uVar58 == '\0') {
LAB_0088c28e:
              iVar45 = 2;
            }
            else {
              uVar59 = (undefined4)uVar58;
              iVar45 = 0;
              if ((uint)POPCOUNT(uVar59) <= uVar61) {
                local_5f00 = in_ZMM25._0_32_;
                local_5ee0 = in_ZMM24._0_32_;
                local_5ec0 = in_ZMM23._0_32_;
                local_5fa8 = puVar54;
                do {
                  k = 0;
                  for (uVar61 = uVar58; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000
                      ) {
                    k = k + 1;
                  }
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  bVar60 = occluded1(local_5e68,local_5f30,root,k,&local_5fb9,ray,
                                     (TravRayK<8,_false> *)&local_5bc0.field_0,context);
                  bVar55 = (byte)(1 << ((uint)k & 0x1f));
                  if (!bVar60) {
                    bVar55 = 0;
                  }
                  bVar43 = bVar43 | bVar55;
                  uVar58 = uVar58 - 1 & uVar58;
                } while (uVar58 != 0);
                if (bVar43 == 0xff) {
                  iVar45 = 3;
                }
                else {
                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  local_59c0._0_4_ =
                       (uint)(bVar43 & 1) * auVar68._0_4_ |
                       (uint)!(bool)(bVar43 & 1) * local_59c0._0_4_;
                  bVar60 = (bool)(bVar43 >> 1 & 1);
                  local_59c0._4_4_ = (uint)bVar60 * auVar68._4_4_ | (uint)!bVar60 * local_59c0._4_4_
                  ;
                  bVar60 = (bool)(bVar43 >> 2 & 1);
                  local_59c0._8_4_ = (uint)bVar60 * auVar68._8_4_ | (uint)!bVar60 * local_59c0._8_4_
                  ;
                  bVar60 = (bool)(bVar43 >> 3 & 1);
                  local_59c0._12_4_ =
                       (uint)bVar60 * auVar68._12_4_ | (uint)!bVar60 * local_59c0._12_4_;
                  bVar60 = (bool)(bVar43 >> 4 & 1);
                  local_59c0._16_4_ =
                       (uint)bVar60 * auVar68._16_4_ | (uint)!bVar60 * local_59c0._16_4_;
                  bVar60 = (bool)(bVar43 >> 5 & 1);
                  local_59c0._20_4_ =
                       (uint)bVar60 * auVar68._20_4_ | (uint)!bVar60 * local_59c0._20_4_;
                  bVar60 = (bool)(bVar43 >> 6 & 1);
                  local_59c0._24_4_ =
                       (uint)bVar60 * auVar68._24_4_ | (uint)!bVar60 * local_59c0._24_4_;
                  local_59c0._28_4_ =
                       (uint)(bVar43 >> 7) * auVar68._28_4_ |
                       (uint)!(bool)(bVar43 >> 7) * local_59c0._28_4_;
                  iVar45 = 2;
                }
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar154 = ZEXT3264(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar155 = ZEXT3264(auVar68);
                auVar62 = vxorps_avx512vl(auVar156._0_16_,auVar156._0_16_);
                auVar156 = ZEXT1664(auVar62);
                auVar62 = vxorps_avx512vl(auVar157._0_16_,auVar157._0_16_);
                auVar157 = ZEXT1664(auVar62);
                in_ZMM23 = ZEXT3264(local_5ec0);
                in_ZMM24 = ZEXT3264(local_5ee0);
                in_ZMM25 = ZEXT3264(local_5f00);
                uVar61 = local_5f90;
                puVar54 = local_5fa8;
              }
              auVar138 = ZEXT3264(_local_5ea0);
              if ((uint)uVar61 < (uint)POPCOUNT(uVar59)) {
                do {
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_0088c27d;
                    uVar18 = vcmpps_avx512vl(auVar138._0_32_,local_59c0,9);
                    if ((char)uVar18 != '\0') {
                      local_5e60 = (ulong)((uint)root.ptr & 0xf) - 8;
                      bVar55 = bVar43;
                      if (local_5e60 != 0) {
                        uVar58 = root.ptr & 0xfffffffffffffff0;
                        bVar55 = ~bVar43;
                        lVar49 = 0;
                        local_5fa8 = puVar54;
                        do {
                          local_5e58 = lVar49;
                          lVar49 = lVar49 * 0x90;
                          auVar62._8_8_ = 0;
                          auVar62._0_8_ = *(ulong *)(uVar58 + 0x40 + lVar49);
                          auVar65._8_8_ = 0;
                          auVar65._0_8_ = *(ulong *)(uVar58 + 0x48 + lVar49);
                          uVar52 = vpcmpub_avx512vl(auVar62,auVar65,2);
                          if ((char)uVar52 != '\0') {
                            lVar49 = lVar49 + uVar58;
                            uVar52 = uVar52 & 0xff;
                            local_5e50 = lVar49;
                            do {
                              lVar47 = 0;
                              for (uVar46 = uVar52; (uVar46 & 1) == 0;
                                  uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                                lVar47 = lVar47 + 1;
                              }
                              auVar64._8_8_ = 0;
                              auVar64._0_8_ = *(ulong *)(lVar49 + 0x40);
                              auVar68 = vpmovzxbd_avx2(auVar64);
                              auVar68 = vcvtdq2ps_avx(auVar68);
                              uVar59 = *(undefined4 *)(lVar49 + 0x7c);
                              auVar76._4_4_ = uVar59;
                              auVar76._0_4_ = uVar59;
                              auVar76._8_4_ = uVar59;
                              auVar76._12_4_ = uVar59;
                              auVar76._16_4_ = uVar59;
                              auVar76._20_4_ = uVar59;
                              auVar76._24_4_ = uVar59;
                              auVar76._28_4_ = uVar59;
                              uVar59 = *(undefined4 *)(lVar49 + 0x70);
                              auVar85._4_4_ = uVar59;
                              auVar85._0_4_ = uVar59;
                              auVar85._8_4_ = uVar59;
                              auVar85._12_4_ = uVar59;
                              auVar85._16_4_ = uVar59;
                              auVar85._20_4_ = uVar59;
                              auVar85._24_4_ = uVar59;
                              auVar85._28_4_ = uVar59;
                              auVar62 = vfmadd213ps_fma(auVar68,auVar76,auVar85);
                              auVar68 = ZEXT1632(auVar62);
                              local_5ce0[0] = (RTCHitN)auVar68[0];
                              local_5ce0[1] = (RTCHitN)auVar68[1];
                              local_5ce0[2] = (RTCHitN)auVar68[2];
                              local_5ce0[3] = (RTCHitN)auVar68[3];
                              local_5ce0[4] = (RTCHitN)auVar68[4];
                              local_5ce0[5] = (RTCHitN)auVar68[5];
                              local_5ce0[6] = (RTCHitN)auVar68[6];
                              local_5ce0[7] = (RTCHitN)auVar68[7];
                              local_5ce0[8] = (RTCHitN)auVar68[8];
                              local_5ce0[9] = (RTCHitN)auVar68[9];
                              local_5ce0[10] = (RTCHitN)auVar68[10];
                              local_5ce0[0xb] = (RTCHitN)auVar68[0xb];
                              local_5ce0[0xc] = (RTCHitN)auVar68[0xc];
                              local_5ce0[0xd] = (RTCHitN)auVar68[0xd];
                              local_5ce0[0xe] = (RTCHitN)auVar68[0xe];
                              local_5ce0[0xf] = (RTCHitN)auVar68[0xf];
                              local_5ce0[0x10] = (RTCHitN)auVar68[0x10];
                              local_5ce0[0x11] = (RTCHitN)auVar68[0x11];
                              local_5ce0[0x12] = (RTCHitN)auVar68[0x12];
                              local_5ce0[0x13] = (RTCHitN)auVar68[0x13];
                              local_5ce0[0x14] = (RTCHitN)auVar68[0x14];
                              local_5ce0[0x15] = (RTCHitN)auVar68[0x15];
                              local_5ce0[0x16] = (RTCHitN)auVar68[0x16];
                              local_5ce0[0x17] = (RTCHitN)auVar68[0x17];
                              local_5ce0[0x18] = (RTCHitN)auVar68[0x18];
                              local_5ce0[0x19] = (RTCHitN)auVar68[0x19];
                              local_5ce0[0x1a] = (RTCHitN)auVar68[0x1a];
                              local_5ce0[0x1b] = (RTCHitN)auVar68[0x1b];
                              local_5ce0[0x1c] = (RTCHitN)auVar68[0x1c];
                              local_5ce0[0x1d] = (RTCHitN)auVar68[0x1d];
                              local_5ce0[0x1e] = (RTCHitN)auVar68[0x1e];
                              local_5ce0[0x1f] = (RTCHitN)auVar68[0x1f];
                              auVar63._8_8_ = 0;
                              auVar63._0_8_ = *(ulong *)(lVar49 + 0x48);
                              auVar68 = vpmovzxbd_avx2(auVar63);
                              auVar68 = vcvtdq2ps_avx(auVar68);
                              auVar62 = vfmadd213ps_fma(auVar68,auVar76,auVar85);
                              local_59a0 = ZEXT1632(auVar62);
                              auVar160._8_8_ = 0;
                              auVar160._0_8_ = *(ulong *)(lVar49 + 0x50);
                              auVar68 = vpmovzxbd_avx2(auVar160);
                              uVar59 = *(undefined4 *)(lVar49 + 0x80);
                              auVar77._4_4_ = uVar59;
                              auVar77._0_4_ = uVar59;
                              auVar77._8_4_ = uVar59;
                              auVar77._12_4_ = uVar59;
                              auVar77._16_4_ = uVar59;
                              auVar77._20_4_ = uVar59;
                              auVar77._24_4_ = uVar59;
                              auVar77._28_4_ = uVar59;
                              auVar68 = vcvtdq2ps_avx(auVar68);
                              uVar59 = *(undefined4 *)(lVar49 + 0x74);
                              auVar106._4_4_ = uVar59;
                              auVar106._0_4_ = uVar59;
                              auVar106._8_4_ = uVar59;
                              auVar106._12_4_ = uVar59;
                              auVar106._16_4_ = uVar59;
                              auVar106._20_4_ = uVar59;
                              auVar106._24_4_ = uVar59;
                              auVar106._28_4_ = uVar59;
                              auVar62 = vfmadd213ps_fma(auVar68,auVar77,auVar106);
                              auVar68 = ZEXT1632(auVar62);
                              local_5f80.valid = (int *)auVar68._0_8_;
                              local_5f80.geometryUserPtr = (void *)auVar68._8_8_;
                              local_5f80.context = (RTCRayQueryContext *)auVar68._16_8_;
                              local_5f80.ray = (RTCRayN *)auVar68._24_8_;
                              auVar4._8_8_ = 0;
                              auVar4._0_8_ = *(ulong *)(lVar49 + 0x58);
                              auVar68 = vpmovzxbd_avx2(auVar4);
                              auVar68 = vcvtdq2ps_avx(auVar68);
                              auVar62 = vfmadd213ps_fma(auVar68,auVar77,auVar106);
                              local_5f20 = ZEXT1632(auVar62);
                              auVar92._8_8_ = 0;
                              auVar92._0_8_ = *(ulong *)(lVar49 + 0x60);
                              auVar68 = vpmovzxbd_avx2(auVar92);
                              uVar59 = *(undefined4 *)(lVar49 + 0x84);
                              auVar78._4_4_ = uVar59;
                              auVar78._0_4_ = uVar59;
                              auVar78._8_4_ = uVar59;
                              auVar78._12_4_ = uVar59;
                              auVar78._16_4_ = uVar59;
                              auVar78._20_4_ = uVar59;
                              auVar78._24_4_ = uVar59;
                              auVar78._28_4_ = uVar59;
                              uVar59 = *(undefined4 *)(lVar49 + 0x78);
                              auVar107._4_4_ = uVar59;
                              auVar107._0_4_ = uVar59;
                              auVar107._8_4_ = uVar59;
                              auVar107._12_4_ = uVar59;
                              auVar107._16_4_ = uVar59;
                              auVar107._20_4_ = uVar59;
                              auVar107._24_4_ = uVar59;
                              auVar107._28_4_ = uVar59;
                              auVar68 = vcvtdq2ps_avx(auVar68);
                              auVar62 = vfmadd213ps_fma(auVar68,auVar78,auVar107);
                              local_5e20 = ZEXT1632(auVar62);
                              auVar158._8_8_ = 0;
                              auVar158._0_8_ = *(ulong *)(lVar49 + 0x68);
                              auVar68 = vpmovzxbd_avx2(auVar158);
                              auVar68 = vcvtdq2ps_avx(auVar68);
                              auVar62 = vfmadd213ps_fma(auVar68,auVar78,auVar107);
                              local_5e40 = ZEXT1632(auVar62);
                              auVar71._4_4_ = fStack_5a9c;
                              auVar71._0_4_ = local_5aa0;
                              auVar71._8_4_ = fStack_5a98;
                              auVar71._12_4_ = fStack_5a94;
                              auVar71._16_4_ = fStack_5a90;
                              auVar71._20_4_ = fStack_5a8c;
                              auVar71._24_4_ = fStack_5a88;
                              auVar71._28_4_ = uStack_5a84;
                              uVar46 = (ulong)(uint)((int)lVar47 * 4);
                              uVar59 = *(undefined4 *)(local_5ce0 + uVar46);
                              auVar124._4_4_ = uVar59;
                              auVar124._0_4_ = uVar59;
                              auVar124._8_4_ = uVar59;
                              auVar124._12_4_ = uVar59;
                              auVar124._16_4_ = uVar59;
                              auVar124._20_4_ = uVar59;
                              auVar124._24_4_ = uVar59;
                              auVar124._28_4_ = uVar59;
                              auVar62 = vfmsub132ps_fma(auVar124,auVar71,local_5b00);
                              auVar75._4_4_ = fStack_5a7c;
                              auVar75._0_4_ = local_5a80;
                              auVar75._8_4_ = fStack_5a78;
                              auVar75._12_4_ = fStack_5a74;
                              auVar75._16_4_ = fStack_5a70;
                              auVar75._20_4_ = fStack_5a6c;
                              auVar75._24_4_ = fStack_5a68;
                              auVar75._28_4_ = uStack_5a64;
                              uVar59 = *(undefined4 *)((long)&local_5f80.valid + uVar46);
                              auVar131._4_4_ = uVar59;
                              auVar131._0_4_ = uVar59;
                              auVar131._8_4_ = uVar59;
                              auVar131._12_4_ = uVar59;
                              auVar131._16_4_ = uVar59;
                              auVar131._20_4_ = uVar59;
                              auVar131._24_4_ = uVar59;
                              auVar131._28_4_ = uVar59;
                              uVar59 = *(undefined4 *)(local_5e20 + uVar46);
                              auVar135._4_4_ = uVar59;
                              auVar135._0_4_ = uVar59;
                              auVar135._8_4_ = uVar59;
                              auVar135._12_4_ = uVar59;
                              auVar135._16_4_ = uVar59;
                              auVar135._20_4_ = uVar59;
                              auVar135._24_4_ = uVar59;
                              auVar135._28_4_ = uVar59;
                              auVar65 = vfmsub132ps_fma(auVar131,auVar75,local_5ae0);
                              auVar64 = vfmsub132ps_fma(auVar135,local_5a60,local_5ac0);
                              uVar59 = *(undefined4 *)(local_59a0 + uVar46);
                              auVar72._4_4_ = uVar59;
                              auVar72._0_4_ = uVar59;
                              auVar72._8_4_ = uVar59;
                              auVar72._12_4_ = uVar59;
                              auVar72._16_4_ = uVar59;
                              auVar72._20_4_ = uVar59;
                              auVar72._24_4_ = uVar59;
                              auVar72._28_4_ = uVar59;
                              auVar69 = vfmsub132ps_avx512vl(local_5b00,auVar71,auVar72);
                              uVar59 = *(undefined4 *)(local_5f20 + uVar46);
                              auVar73._4_4_ = uVar59;
                              auVar73._0_4_ = uVar59;
                              auVar73._8_4_ = uVar59;
                              auVar73._12_4_ = uVar59;
                              auVar73._16_4_ = uVar59;
                              auVar73._20_4_ = uVar59;
                              auVar73._24_4_ = uVar59;
                              auVar73._28_4_ = uVar59;
                              auVar66 = vfmsub132ps_avx512vl(local_5ae0,auVar75,auVar73);
                              uVar59 = *(undefined4 *)(local_5e40 + uVar46);
                              auVar74._4_4_ = uVar59;
                              auVar74._0_4_ = uVar59;
                              auVar74._8_4_ = uVar59;
                              auVar74._12_4_ = uVar59;
                              auVar74._16_4_ = uVar59;
                              auVar74._20_4_ = uVar59;
                              auVar74._24_4_ = uVar59;
                              auVar74._28_4_ = uVar59;
                              auVar70 = vfmsub132ps_avx512vl(local_5ac0,local_5a60,auVar74);
                              auVar68 = vpminsd_avx2(ZEXT1632(auVar62),auVar69);
                              auVar67 = vpminsd_avx2(ZEXT1632(auVar65),auVar66);
                              auVar68 = vpmaxsd_avx2(auVar68,auVar67);
                              auVar67 = vpminsd_avx2(ZEXT1632(auVar64),auVar70);
                              auVar68 = vpmaxsd_avx2(auVar68,auVar67);
                              auVar67 = vpmaxsd_avx2(ZEXT1632(auVar62),auVar69);
                              auVar69 = vpmaxsd_avx2(ZEXT1632(auVar65),auVar66);
                              auVar69 = vpminsd_avx2(auVar67,auVar69);
                              auVar67 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar70);
                              auVar67 = vpminsd_avx2(auVar69,auVar67);
                              auVar68 = vpmaxsd_avx2(auVar68,local_59e0);
                              auVar67 = vpminsd_avx2(auVar67,local_59c0);
                              uVar18 = vpcmpd_avx512vl(auVar68,auVar67,2);
                              if ((bVar55 & (byte)uVar18) == 0) {
                                bVar60 = false;
                              }
                              else {
                                local_5e48 = uVar52;
                                uVar5 = *(ushort *)(lVar49 + lVar47 * 8);
                                uVar6 = *(ushort *)(lVar49 + 2 + lVar47 * 8);
                                pGVar7 = (context->scene->geometries).items
                                         [*(uint *)(lVar49 + 0x88)].ptr;
                                lVar53 = *(long *)&pGVar7->field_0x58;
                                lVar8 = *(long *)&pGVar7[1].time_range.upper;
                                lVar47 = (ulong)*(uint *)(lVar49 + 4 + lVar47 * 8) *
                                         pGVar7[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                                local_5fac = uVar5 & 0x7fff;
                                local_5fb0 = uVar6 & 0x7fff;
                                uVar44 = *(uint *)(lVar53 + 4 + lVar47);
                                uVar52 = (ulong)uVar44;
                                uVar46 = (ulong)(uVar44 * local_5fb0 +
                                                *(int *)(lVar53 + lVar47) + local_5fac);
                                p_Var9 = pGVar7[1].intersectionFilterN;
                                puVar1 = (undefined8 *)(lVar8 + (uVar46 + 1) * (long)p_Var9);
                                local_59a0._16_8_ = *puVar1;
                                local_59a0._24_8_ = puVar1[1];
                                lVar49 = uVar46 + uVar52;
                                puVar1 = (undefined8 *)(lVar8 + lVar49 * (long)p_Var9);
                                local_5970 = *puVar1;
                                uStack_5968 = puVar1[1];
                                lVar56 = uVar46 + uVar52 + 1;
                                puVar1 = (undefined8 *)(lVar8 + lVar56 * (long)p_Var9);
                                local_5980 = *puVar1;
                                uStack_5978 = puVar1[1];
                                uVar61 = (ulong)(-1 < (short)uVar5);
                                puVar1 = (undefined8 *)
                                         (lVar8 + (uVar46 + uVar61 + 1) * (long)p_Var9);
                                lVar50 = uVar61 + lVar56;
                                puVar2 = (undefined8 *)(lVar8 + lVar50 * (long)p_Var9);
                                local_5940 = *puVar2;
                                uStack_5938 = puVar2[1];
                                if ((short)uVar6 < 0) {
                                  uVar52 = 0;
                                }
                                puVar2 = (undefined8 *)(lVar8 + (lVar49 + uVar52) * (long)p_Var9);
                                puVar3 = (undefined8 *)(lVar8 + (lVar56 + uVar52) * (long)p_Var9);
                                local_5900 = *puVar3;
                                uStack_58f8 = puVar3[1];
                                puVar3 = (undefined8 *)(lVar8 + (uVar52 + lVar50) * (long)p_Var9);
                                auVar62 = vpbroadcastd_avx512vl();
                                auVar138 = ZEXT1664(auVar62);
                                local_59a0._0_16_ =
                                     *(undefined1 (*) [16])(lVar8 + (long)p_Var9 * uVar46);
                                local_5960 = local_59a0._16_8_;
                                uStack_5958 = local_59a0._24_8_;
                                local_5950 = *puVar1;
                                uStack_5948 = puVar1[1];
                                local_5930 = local_5980;
                                uStack_5928 = uStack_5978;
                                local_5920 = local_5970;
                                uStack_5918 = uStack_5968;
                                local_5910 = local_5980;
                                uStack_5908 = uStack_5978;
                                local_58f0 = *puVar2;
                                uStack_58e8 = puVar2[1];
                                local_58e0 = local_5980;
                                uStack_58d8 = uStack_5978;
                                local_58d0 = local_5940;
                                uStack_58c8 = uStack_5938;
                                local_58c0 = *puVar3;
                                uStack_58b8 = puVar3[1];
                                local_58b0 = local_5900;
                                uStack_58a8 = uStack_58f8;
                                auVar62 = vpbroadcastd_avx512vl();
                                auVar159 = ZEXT1664(auVar62);
                                pfVar51 = (float *)&uStack_5968;
                                uVar61 = 0;
                                bVar48 = bVar55;
                                do {
                                  fVar113 = pfVar51[-0xe];
                                  auVar119._4_4_ = fVar113;
                                  auVar119._0_4_ = fVar113;
                                  auVar119._8_4_ = fVar113;
                                  auVar119._12_4_ = fVar113;
                                  auVar120._16_4_ = fVar113;
                                  auVar120._0_16_ = auVar119;
                                  auVar120._20_4_ = fVar113;
                                  auVar120._24_4_ = fVar113;
                                  auVar120._28_4_ = fVar113;
                                  fVar114 = pfVar51[-0xd];
                                  auVar127._4_4_ = fVar114;
                                  auVar127._0_4_ = fVar114;
                                  auVar127._8_4_ = fVar114;
                                  auVar127._12_4_ = fVar114;
                                  auVar127._16_4_ = fVar114;
                                  auVar127._20_4_ = fVar114;
                                  auVar127._24_4_ = fVar114;
                                  auVar127._28_4_ = fVar114;
                                  fVar115 = pfVar51[-0xc];
                                  auVar133._4_4_ = fVar115;
                                  auVar133._0_4_ = fVar115;
                                  auVar133._8_4_ = fVar115;
                                  auVar133._12_4_ = fVar115;
                                  auVar133._16_4_ = fVar115;
                                  auVar133._20_4_ = fVar115;
                                  auVar133._24_4_ = fVar115;
                                  auVar133._28_4_ = fVar115;
                                  auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar51[-10]));
                                  local_5ea0._4_4_ = pfVar51[-9];
                                  local_5840 = pfVar51[-8];
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar51[-6]));
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar51[-5]));
                                  auVar74 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar51[-4]));
                                  local_5860 = pfVar51[-2];
                                  local_5880 = pfVar51[-1];
                                  local_58a0 = *pfVar51;
                                  auVar62 = vmovdqa64_avx512vl(auVar159._0_16_);
                                  local_5e20._0_16_ = auVar62;
                                  auVar158 = auVar138._0_16_;
                                  auVar62 = vmovdqa64_avx512vl(auVar158);
                                  local_5e40._0_16_ = auVar62;
                                  auVar62 = vsubss_avx512f(auVar119,auVar71._0_16_);
                                  fVar105 = auVar62._0_4_;
                                  auVar125._4_4_ = fVar105;
                                  auVar125._0_4_ = fVar105;
                                  auVar125._8_4_ = fVar105;
                                  auVar125._12_4_ = fVar105;
                                  auVar125._16_4_ = fVar105;
                                  auVar125._20_4_ = fVar105;
                                  auVar125._24_4_ = fVar105;
                                  auVar125._28_4_ = fVar105;
                                  local_5ea0._0_4_ = local_5ea0._4_4_;
                                  fStack_5e98 = (float)local_5ea0._4_4_;
                                  fStack_5e94 = (float)local_5ea0._4_4_;
                                  fStack_5e90 = (float)local_5ea0._4_4_;
                                  fStack_5e8c = (float)local_5ea0._4_4_;
                                  fStack_5e88 = (float)local_5ea0._4_4_;
                                  fStack_5e84 = (float)local_5ea0._4_4_;
                                  fVar116 = fVar114 - (float)local_5ea0._4_4_;
                                  auVar136._4_4_ = fVar116;
                                  auVar136._0_4_ = fVar116;
                                  auVar136._8_4_ = fVar116;
                                  auVar136._12_4_ = fVar116;
                                  auVar136._16_4_ = fVar116;
                                  auVar136._20_4_ = fVar116;
                                  auVar136._24_4_ = fVar116;
                                  auVar136._28_4_ = fVar116;
                                  fStack_583c = local_5840;
                                  fStack_5838 = local_5840;
                                  fStack_5834 = local_5840;
                                  fStack_5830 = local_5840;
                                  fStack_582c = local_5840;
                                  fStack_5828 = local_5840;
                                  fStack_5824 = local_5840;
                                  fVar117 = fVar115 - local_5840;
                                  auVar139._4_4_ = fVar117;
                                  auVar139._0_4_ = fVar117;
                                  auVar139._8_4_ = fVar117;
                                  auVar139._12_4_ = fVar117;
                                  auVar139._16_4_ = fVar117;
                                  auVar139._20_4_ = fVar117;
                                  auVar139._24_4_ = fVar117;
                                  auVar139._28_4_ = fVar117;
                                  fStack_585c = local_5860;
                                  fStack_5858 = local_5860;
                                  fStack_5854 = local_5860;
                                  fStack_5850 = local_5860;
                                  fStack_584c = local_5860;
                                  fStack_5848 = local_5860;
                                  fStack_5844 = local_5860;
                                  fVar113 = local_5860 - fVar113;
                                  auVar153._4_4_ = fVar113;
                                  auVar153._0_4_ = fVar113;
                                  auVar153._8_4_ = fVar113;
                                  auVar153._12_4_ = fVar113;
                                  auVar153._16_4_ = fVar113;
                                  auVar153._20_4_ = fVar113;
                                  auVar153._24_4_ = fVar113;
                                  auVar153._28_4_ = fVar113;
                                  fStack_587c = local_5880;
                                  fStack_5878 = local_5880;
                                  fStack_5874 = local_5880;
                                  fStack_5870 = local_5880;
                                  fStack_586c = local_5880;
                                  fStack_5868 = local_5880;
                                  fStack_5864 = local_5880;
                                  auVar75 = vbroadcastss_avx512vl
                                                      (ZEXT416((uint)(local_5880 - fVar114)));
                                  fStack_589c = local_58a0;
                                  fStack_5898 = local_58a0;
                                  fStack_5894 = local_58a0;
                                  fStack_5890 = local_58a0;
                                  fStack_588c = local_58a0;
                                  fStack_5888 = local_58a0;
                                  fStack_5884 = local_58a0;
                                  auVar76 = vbroadcastss_avx512vl
                                                      (ZEXT416((uint)(local_58a0 - fVar115)));
                                  fVar116 = (local_58a0 - fVar115) * fVar116;
                                  auVar93._4_4_ = fVar116;
                                  auVar93._0_4_ = fVar116;
                                  auVar93._8_4_ = fVar116;
                                  auVar93._12_4_ = fVar116;
                                  auVar93._16_4_ = fVar116;
                                  auVar93._20_4_ = fVar116;
                                  auVar93._24_4_ = fVar116;
                                  auVar93._28_4_ = fVar116;
                                  auVar77 = vfmsub231ps_avx512vl(auVar93,auVar75,auVar139);
                                  fVar113 = fVar117 * fVar113;
                                  auVar100._4_4_ = fVar113;
                                  auVar100._0_4_ = fVar113;
                                  auVar100._8_4_ = fVar113;
                                  auVar100._12_4_ = fVar113;
                                  auVar100._16_4_ = fVar113;
                                  auVar100._20_4_ = fVar113;
                                  auVar100._24_4_ = fVar113;
                                  auVar100._28_4_ = fVar113;
                                  auVar78 = vfmsub231ps_avx512vl(auVar100,auVar76,auVar125);
                                  uVar44 = auVar78._28_4_;
                                  auVar104 = ZEXT436(uVar44);
                                  fVar105 = (local_5880 - fVar114) * fVar105;
                                  auVar108._4_4_ = fVar105;
                                  auVar108._0_4_ = fVar105;
                                  auVar108._8_4_ = fVar105;
                                  auVar108._12_4_ = fVar105;
                                  auVar108._16_4_ = fVar105;
                                  auVar108._20_4_ = fVar105;
                                  auVar108._24_4_ = fVar105;
                                  auVar108._28_4_ = fVar105;
                                  auVar64 = vfmsub231ps_fma(auVar108,auVar153,auVar136);
                                  auVar118 = (undefined1  [36])0x0;
                                  auVar66 = vsubps_avx(auVar120,*(undefined1 (*) [32])ray);
                                  auVar70 = vsubps_avx(auVar127,*(undefined1 (*) [32])(ray + 0x20));
                                  auVar84 = vsubps_avx(auVar133,*(undefined1 (*) [32])(ray + 0x40));
                                  auVar68 = *(undefined1 (*) [32])(ray + 0x80);
                                  auVar67 = *(undefined1 (*) [32])(ray + 0xa0);
                                  auVar69 = *(undefined1 (*) [32])(ray + 0xc0);
                                  auVar146._0_4_ = auVar67._0_4_ * auVar84._0_4_;
                                  auVar146._4_4_ = auVar67._4_4_ * auVar84._4_4_;
                                  auVar146._8_4_ = auVar67._8_4_ * auVar84._8_4_;
                                  auVar146._12_4_ = auVar67._12_4_ * auVar84._12_4_;
                                  auVar146._16_4_ = auVar67._16_4_ * auVar84._16_4_;
                                  auVar146._20_4_ = auVar67._20_4_ * auVar84._20_4_;
                                  auVar146._28_36_ = in_ZMM12._28_36_;
                                  auVar146._24_4_ = auVar67._24_4_ * auVar84._24_4_;
                                  auVar63 = vfmsub231ps_fma(auVar146._0_32_,auVar70,auVar69);
                                  auVar147._0_4_ = auVar69._0_4_ * auVar66._0_4_;
                                  auVar147._4_4_ = auVar69._4_4_ * auVar66._4_4_;
                                  auVar147._8_4_ = auVar69._8_4_ * auVar66._8_4_;
                                  auVar147._12_4_ = auVar69._12_4_ * auVar66._12_4_;
                                  auVar147._16_4_ = auVar69._16_4_ * auVar66._16_4_;
                                  auVar147._20_4_ = auVar69._20_4_ * auVar66._20_4_;
                                  auVar147._28_36_ = in_ZMM13._28_36_;
                                  auVar147._24_4_ = auVar69._24_4_ * auVar66._24_4_;
                                  auVar160 = vfmsub231ps_fma(auVar147._0_32_,auVar84,auVar68);
                                  auVar150._0_4_ = auVar68._0_4_ * auVar70._0_4_;
                                  auVar150._4_4_ = auVar68._4_4_ * auVar70._4_4_;
                                  auVar150._8_4_ = auVar68._8_4_ * auVar70._8_4_;
                                  auVar150._12_4_ = auVar68._12_4_ * auVar70._12_4_;
                                  auVar150._16_4_ = auVar68._16_4_ * auVar70._16_4_;
                                  auVar150._20_4_ = auVar68._20_4_ * auVar70._20_4_;
                                  auVar150._28_36_ = in_ZMM14._28_36_;
                                  auVar150._24_4_ = auVar68._24_4_ * auVar70._24_4_;
                                  auVar4 = vfmsub231ps_fma(auVar150._0_32_,auVar66,auVar67);
                                  auVar152 = (undefined1  [36])0x0;
                                  auVar28._4_4_ = auVar64._4_4_ * auVar69._4_4_;
                                  auVar28._0_4_ = auVar64._0_4_ * auVar69._0_4_;
                                  auVar28._8_4_ = auVar64._8_4_ * auVar69._8_4_;
                                  auVar28._12_4_ = auVar64._12_4_ * auVar69._12_4_;
                                  auVar28._16_4_ = auVar69._16_4_ * 0.0;
                                  auVar28._20_4_ = auVar69._20_4_ * 0.0;
                                  auVar28._24_4_ = auVar69._24_4_ * 0.0;
                                  auVar28._28_4_ = auVar69._28_4_;
                                  auVar62 = vfmadd231ps_fma(auVar28,auVar78,auVar67);
                                  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar77,auVar68);
                                  vandps_avx512vl(ZEXT1632(auVar62),auVar155._0_32_);
                                  auVar68 = vmulps_avx512vl(auVar76,ZEXT1632(auVar4));
                                  auVar68 = vfmadd231ps_avx512vl(auVar68,ZEXT1632(auVar160),auVar75)
                                  ;
                                  auVar92 = auVar68._16_16_;
                                  auVar65 = vfmadd231ps_fma(auVar68,ZEXT1632(auVar63),auVar153);
                                  uVar140 = auVar78._0_4_;
                                  auVar128._0_4_ = uVar140 ^ auVar65._0_4_;
                                  uVar141 = auVar78._4_4_;
                                  auVar128._4_4_ = uVar141 ^ auVar65._4_4_;
                                  uVar142 = auVar78._8_4_;
                                  auVar128._8_4_ = uVar142 ^ auVar65._8_4_;
                                  uVar143 = auVar78._12_4_;
                                  auVar128._12_4_ = uVar143 ^ auVar65._12_4_;
                                  uVar59 = auVar78._16_4_;
                                  auVar128._16_4_ = uVar59;
                                  uVar144 = auVar78._20_4_;
                                  auVar128._20_4_ = uVar144;
                                  uVar145 = auVar78._24_4_;
                                  auVar128._24_4_ = uVar145;
                                  auVar128._28_4_ = uVar44;
                                  uVar18 = vcmpps_avx512vl(auVar128,auVar156._0_32_,5);
                                  bVar42 = (byte)uVar18 & bVar48;
                                  if (bVar42 == 0) {
LAB_0088b632:
                                    uVar44 = 0;
                                  }
                                  else {
                                    auVar30._4_4_ = fVar117 * auVar4._4_4_;
                                    auVar30._0_4_ = fVar117 * auVar4._0_4_;
                                    auVar30._8_4_ = fVar117 * auVar4._8_4_;
                                    auVar30._12_4_ = fVar117 * auVar4._12_4_;
                                    auVar30._16_4_ = fVar117 * 0.0;
                                    auVar30._20_4_ = fVar117 * 0.0;
                                    auVar30._24_4_ = fVar117 * 0.0;
                                    auVar30._28_4_ = fVar117;
                                    auVar65 = vfmadd213ps_fma(ZEXT1632(auVar160),auVar136,auVar30);
                                    auVar65 = vfmadd213ps_fma(ZEXT1632(auVar63),auVar125,
                                                              ZEXT1632(auVar65));
                                    auVar126._0_4_ = uVar140 ^ auVar65._0_4_;
                                    auVar126._4_4_ = uVar141 ^ auVar65._4_4_;
                                    auVar126._8_4_ = uVar142 ^ auVar65._8_4_;
                                    auVar126._12_4_ = uVar143 ^ auVar65._12_4_;
                                    auVar126._16_4_ = uVar59;
                                    auVar126._20_4_ = uVar144;
                                    auVar126._24_4_ = uVar145;
                                    auVar126._28_4_ = uVar44;
                                    uVar18 = vcmpps_avx512vl(auVar126,auVar156._0_32_,5);
                                    bVar42 = bVar42 & (byte)uVar18;
                                    if (bVar42 == 0) goto LAB_0088b632;
                                    auVar27._8_4_ = 0x7fffffff;
                                    auVar27._0_8_ = 0x7fffffff7fffffff;
                                    auVar27._12_4_ = 0x7fffffff;
                                    auVar27._16_4_ = 0x7fffffff;
                                    auVar27._20_4_ = 0x7fffffff;
                                    auVar27._24_4_ = 0x7fffffff;
                                    auVar27._28_4_ = 0x7fffffff;
                                    vandps_avx512vl(ZEXT1632(auVar62),auVar27);
                                    auVar67 = vsubps_avx(auVar68,auVar128);
                                    uVar18 = vcmpps_avx512vl(auVar67,auVar126,5);
                                    bVar42 = bVar42 & (byte)uVar18;
                                    if (bVar42 == 0) goto LAB_0088b632;
                                    auVar31._4_4_ = auVar84._4_4_ * auVar64._4_4_;
                                    auVar31._0_4_ = auVar84._0_4_ * auVar64._0_4_;
                                    auVar31._8_4_ = auVar84._8_4_ * auVar64._8_4_;
                                    auVar31._12_4_ = auVar84._12_4_ * auVar64._12_4_;
                                    auVar31._16_4_ = auVar84._16_4_ * 0.0;
                                    auVar31._20_4_ = auVar84._20_4_ * 0.0;
                                    auVar31._24_4_ = auVar84._24_4_ * 0.0;
                                    auVar31._28_4_ = auVar84._28_4_;
                                    auVar65 = vfmadd213ps_fma(auVar70,auVar78,auVar31);
                                    auVar65 = vfmadd213ps_fma(auVar66,auVar77,ZEXT1632(auVar65));
                                    auVar132._0_4_ = auVar68._0_4_ * *(float *)(ray + 0x60);
                                    auVar132._4_4_ = auVar68._4_4_ * *(float *)(ray + 100);
                                    auVar132._8_4_ = auVar68._8_4_ * *(float *)(ray + 0x68);
                                    auVar132._12_4_ = auVar68._12_4_ * *(float *)(ray + 0x6c);
                                    auVar132._16_4_ = auVar68._16_4_ * *(float *)(ray + 0x70);
                                    auVar132._20_4_ = auVar68._20_4_ * *(float *)(ray + 0x74);
                                    auVar132._24_4_ = auVar68._24_4_ * *(float *)(ray + 0x78);
                                    auVar132._28_4_ = 0;
                                    auVar121._0_4_ = uVar140 ^ auVar65._0_4_;
                                    auVar121._4_4_ = uVar141 ^ auVar65._4_4_;
                                    auVar121._8_4_ = uVar142 ^ auVar65._8_4_;
                                    auVar121._12_4_ = uVar143 ^ auVar65._12_4_;
                                    auVar121._16_4_ = uVar59;
                                    auVar121._20_4_ = uVar144;
                                    auVar121._24_4_ = uVar145;
                                    auVar121._28_4_ = uVar44;
                                    auVar32._4_4_ = auVar68._4_4_ * *(float *)(ray + 0x104);
                                    auVar32._0_4_ = auVar68._0_4_ * *(float *)(ray + 0x100);
                                    auVar32._8_4_ = auVar68._8_4_ * *(float *)(ray + 0x108);
                                    auVar32._12_4_ = auVar68._12_4_ * *(float *)(ray + 0x10c);
                                    auVar32._16_4_ = auVar68._16_4_ * *(float *)(ray + 0x110);
                                    auVar32._20_4_ = auVar68._20_4_ * *(float *)(ray + 0x114);
                                    auVar32._24_4_ = auVar68._24_4_ * *(float *)(ray + 0x118);
                                    auVar32._28_4_ = auVar84._28_4_;
                                    uVar18 = vcmpps_avx512vl(auVar121,auVar32,2);
                                    uVar19 = vcmpps_avx512vl(auVar132,auVar121,1);
                                    bVar42 = bVar42 & (byte)uVar18 & (byte)uVar19;
                                    if (bVar42 == 0) {
                                      uVar44 = 0;
                                    }
                                    else {
                                      uVar18 = vcmpps_avx512vl(ZEXT1632(auVar62),ZEXT832(0) << 0x20,
                                                               4);
                                      bVar42 = bVar42 & (byte)uVar18;
                                      uVar44 = (uint)bVar42;
                                      if (bVar42 != 0) {
                                        in_ZMM23 = ZEXT3264(auVar128);
                                        in_ZMM24 = ZEXT3264(auVar126);
                                        local_5da0 = auVar121;
                                        in_ZMM25 = ZEXT3264(auVar68);
                                        local_5dc0 = auVar77;
                                        local_5de0 = auVar78;
                                        local_5e00 = ZEXT1632(auVar64);
                                      }
                                    }
                                    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar154 = ZEXT3264(auVar68);
                                    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar155 = ZEXT3264(auVar68);
                                    auVar92 = auVar68._16_16_;
                                    auVar62 = vxorps_avx512vl(auVar156._0_16_,auVar156._0_16_);
                                    auVar156 = ZEXT1664(auVar62);
                                    auVar62 = vxorps_avx512vl(auVar157._0_16_,auVar157._0_16_);
                                    auVar157 = ZEXT1664(auVar62);
                                  }
                                  auVar149 = (undefined1  [36])0x0;
                                  auVar62 = auVar156._0_16_;
                                  auVar65 = auVar157._0_16_;
                                  bVar42 = (byte)uVar44;
                                  if (bVar42 != 0) {
                                    auVar64 = vcvtsi2ss_avx512f(auVar158,*(ushort *)
                                                                          (lVar53 + 8 + lVar47) - 1)
                                    ;
                                    auVar80._16_16_ = auVar92;
                                    auVar80._0_16_ = auVar65;
                                    auVar79._4_28_ = auVar80._4_28_;
                                    auVar79._0_4_ = auVar64._0_4_;
                                    auVar63 = vrcp14ss_avx512f(auVar65,auVar79._0_16_);
                                    auVar64 = vfnmadd213ss_avx512f
                                                        (auVar64,auVar63,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar113 = auVar63._0_4_ * auVar64._0_4_;
                                    auVar64 = vcvtsi2ss_avx512f(auVar158,*(ushort *)
                                                                          (lVar53 + 10 + lVar47) - 1
                                                               );
                                    auVar82._16_16_ = auVar92;
                                    auVar82._0_16_ = auVar65;
                                    auVar81._4_28_ = auVar82._4_28_;
                                    auVar81._0_4_ = auVar64._0_4_;
                                    auVar63 = vrcp14ss_avx512f(auVar65,auVar81._0_16_);
                                    auVar64 = vfnmadd213ss_avx512f
                                                        (auVar64,auVar63,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar114 = auVar63._0_4_ * auVar64._0_4_;
                                    auVar64 = vcvtsi2ss_avx512f(auVar158,((uint)uVar61 & 1) +
                                                                         local_5fac);
                                    auVar109._0_4_ = auVar64._0_4_;
                                    auVar109._4_4_ = auVar109._0_4_;
                                    auVar109._8_4_ = auVar109._0_4_;
                                    auVar109._12_4_ = auVar109._0_4_;
                                    auVar109._16_4_ = auVar109._0_4_;
                                    auVar109._20_4_ = auVar109._0_4_;
                                    auVar109._24_4_ = auVar109._0_4_;
                                    auVar109._28_4_ = auVar109._0_4_;
                                    local_5f00 = in_ZMM25._0_32_;
                                    auVar68 = vmulps_avx512vl(auVar109,local_5f00);
                                    auVar83 = vaddps_avx512vl(in_ZMM23._0_32_,auVar68);
                                    auVar118 = ZEXT436(auVar83._28_4_);
                                    auVar94._4_4_ = fVar113;
                                    auVar94._0_4_ = fVar113;
                                    auVar94._8_4_ = fVar113;
                                    auVar94._12_4_ = fVar113;
                                    auVar94._16_4_ = fVar113;
                                    auVar94._20_4_ = fVar113;
                                    auVar94._24_4_ = fVar113;
                                    auVar94._28_4_ = fVar113;
                                    auVar68 = vmulps_avx512vl(auVar83,auVar94);
                                    local_5ec0._0_4_ =
                                         (uint)(bVar42 & 1) * auVar68._0_4_ |
                                         (uint)!(bool)(bVar42 & 1) * in_ZMM23._0_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 1) & 1);
                                    local_5ec0._4_4_ =
                                         (uint)bVar60 * auVar68._4_4_ |
                                         (uint)!bVar60 * in_ZMM23._4_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 2) & 1);
                                    local_5ec0._8_4_ =
                                         (uint)bVar60 * auVar68._8_4_ |
                                         (uint)!bVar60 * in_ZMM23._8_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 3) & 1);
                                    local_5ec0._12_4_ =
                                         (uint)bVar60 * auVar68._12_4_ |
                                         (uint)!bVar60 * in_ZMM23._12_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 4) & 1);
                                    local_5ec0._16_4_ =
                                         (uint)bVar60 * auVar68._16_4_ |
                                         (uint)!bVar60 * in_ZMM23._16_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 5) & 1);
                                    local_5ec0._20_4_ =
                                         (uint)bVar60 * auVar68._20_4_ |
                                         (uint)!bVar60 * in_ZMM23._20_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 6) & 1);
                                    local_5ec0._24_4_ =
                                         (uint)bVar60 * auVar68._24_4_ |
                                         (uint)!bVar60 * in_ZMM23._24_4_;
                                    local_5ec0._28_4_ =
                                         (uVar44 >> 7) * auVar68._28_4_ |
                                         (uint)!SUB41(uVar44 >> 7,0) * in_ZMM23._28_4_;
                                    in_ZMM23 = ZEXT3264(local_5ec0);
                                    auVar64 = vcvtsi2ss_avx512f(auVar158,((uint)(uVar61 >> 1) &
                                                                         0x7fffffff) + local_5fb0);
                                    auVar95._0_4_ = auVar64._0_4_;
                                    auVar95._4_4_ = auVar95._0_4_;
                                    auVar95._8_4_ = auVar95._0_4_;
                                    auVar95._12_4_ = auVar95._0_4_;
                                    auVar95._16_4_ = auVar95._0_4_;
                                    auVar95._20_4_ = auVar95._0_4_;
                                    auVar95._24_4_ = auVar95._0_4_;
                                    auVar95._28_4_ = auVar95._0_4_;
                                    auVar68 = vmulps_avx512vl(auVar95,local_5f00);
                                    auVar68 = vaddps_avx512vl(in_ZMM24._0_32_,auVar68);
                                    auVar101._4_4_ = fVar114;
                                    auVar101._0_4_ = fVar114;
                                    auVar101._8_4_ = fVar114;
                                    auVar101._12_4_ = fVar114;
                                    auVar101._16_4_ = fVar114;
                                    auVar101._20_4_ = fVar114;
                                    auVar101._24_4_ = fVar114;
                                    auVar101._28_4_ = fVar114;
                                    auVar104 = ZEXT436((uint)fVar114);
                                    auVar68 = vmulps_avx512vl(auVar68,auVar101);
                                    local_5ee0._0_4_ =
                                         (uint)(bVar42 & 1) * auVar68._0_4_ |
                                         (uint)!(bool)(bVar42 & 1) * in_ZMM24._0_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 1) & 1);
                                    local_5ee0._4_4_ =
                                         (uint)bVar60 * auVar68._4_4_ |
                                         (uint)!bVar60 * in_ZMM24._4_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 2) & 1);
                                    local_5ee0._8_4_ =
                                         (uint)bVar60 * auVar68._8_4_ |
                                         (uint)!bVar60 * in_ZMM24._8_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 3) & 1);
                                    local_5ee0._12_4_ =
                                         (uint)bVar60 * auVar68._12_4_ |
                                         (uint)!bVar60 * in_ZMM24._12_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 4) & 1);
                                    local_5ee0._16_4_ =
                                         (uint)bVar60 * auVar68._16_4_ |
                                         (uint)!bVar60 * in_ZMM24._16_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 5) & 1);
                                    local_5ee0._20_4_ =
                                         (uint)bVar60 * auVar68._20_4_ |
                                         (uint)!bVar60 * in_ZMM24._20_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 6) & 1);
                                    local_5ee0._24_4_ =
                                         (uint)bVar60 * auVar68._24_4_ |
                                         (uint)!bVar60 * in_ZMM24._24_4_;
                                    local_5ee0._28_4_ =
                                         (uVar44 >> 7) * auVar68._28_4_ |
                                         (uint)!SUB41(uVar44 >> 7,0) * in_ZMM24._28_4_;
                                    in_ZMM24 = ZEXT3264(local_5ee0);
                                    pGVar7 = (context->scene->geometries).items
                                             [*(uint *)(local_5e20 + uVar61 * 4)].ptr;
                                    uVar44 = pGVar7->mask;
                                    auVar96._4_4_ = uVar44;
                                    auVar96._0_4_ = uVar44;
                                    auVar96._8_4_ = uVar44;
                                    auVar96._12_4_ = uVar44;
                                    auVar96._16_4_ = uVar44;
                                    auVar96._20_4_ = uVar44;
                                    auVar96._24_4_ = uVar44;
                                    auVar96._28_4_ = uVar44;
                                    uVar18 = vptestmd_avx512vl(auVar96,*(undefined1 (*) [32])
                                                                        (ray + 0x120));
                                    bVar42 = (byte)uVar18 & bVar42;
                                    uVar52 = (ulong)bVar42;
                                    if (bVar42 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (auVar104 = ZEXT436((uint)fVar114),
                                         auVar152 = (undefined1  [36])0x0,
                                         pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar68 = vrcp14ps_avx512vl(local_5f00);
                                        auVar26._8_4_ = 0x3f800000;
                                        auVar26._0_8_ = &DAT_3f8000003f800000;
                                        auVar26._12_4_ = 0x3f800000;
                                        auVar26._16_4_ = 0x3f800000;
                                        auVar26._20_4_ = 0x3f800000;
                                        auVar26._24_4_ = 0x3f800000;
                                        auVar26._28_4_ = 0x3f800000;
                                        auVar67 = vfnmadd213ps_avx512vl(auVar68,local_5f00,auVar26);
                                        auVar64 = vfmadd132ps_fma(auVar67,auVar68,auVar68);
                                        auVar104 = (undefined1  [36])0x0;
                                        local_5c80 = vmulps_avx512vl(local_5ec0,ZEXT1632(auVar64));
                                        local_5c60 = vmulps_avx512vl(local_5ee0,ZEXT1632(auVar64));
                                        pRVar10 = context->user;
                                        local_5c20 = vpbroadcastd_avx512vl();
                                        local_5c40 = vpbroadcastd_avx512vl();
                                        local_5ce0[0] = (RTCHitN)local_5dc0[0];
                                        local_5ce0[1] = (RTCHitN)local_5dc0[1];
                                        local_5ce0[2] = (RTCHitN)local_5dc0[2];
                                        local_5ce0[3] = (RTCHitN)local_5dc0[3];
                                        local_5ce0[4] = (RTCHitN)local_5dc0[4];
                                        local_5ce0[5] = (RTCHitN)local_5dc0[5];
                                        local_5ce0[6] = (RTCHitN)local_5dc0[6];
                                        local_5ce0[7] = (RTCHitN)local_5dc0[7];
                                        local_5ce0[8] = (RTCHitN)local_5dc0[8];
                                        local_5ce0[9] = (RTCHitN)local_5dc0[9];
                                        local_5ce0[10] = (RTCHitN)local_5dc0[10];
                                        local_5ce0[0xb] = (RTCHitN)local_5dc0[0xb];
                                        local_5ce0[0xc] = (RTCHitN)local_5dc0[0xc];
                                        local_5ce0[0xd] = (RTCHitN)local_5dc0[0xd];
                                        local_5ce0[0xe] = (RTCHitN)local_5dc0[0xe];
                                        local_5ce0[0xf] = (RTCHitN)local_5dc0[0xf];
                                        local_5ce0[0x10] = (RTCHitN)local_5dc0[0x10];
                                        local_5ce0[0x11] = (RTCHitN)local_5dc0[0x11];
                                        local_5ce0[0x12] = (RTCHitN)local_5dc0[0x12];
                                        local_5ce0[0x13] = (RTCHitN)local_5dc0[0x13];
                                        local_5ce0[0x14] = (RTCHitN)local_5dc0[0x14];
                                        local_5ce0[0x15] = (RTCHitN)local_5dc0[0x15];
                                        local_5ce0[0x16] = (RTCHitN)local_5dc0[0x16];
                                        local_5ce0[0x17] = (RTCHitN)local_5dc0[0x17];
                                        local_5ce0[0x18] = (RTCHitN)local_5dc0[0x18];
                                        local_5ce0[0x19] = (RTCHitN)local_5dc0[0x19];
                                        local_5ce0[0x1a] = (RTCHitN)local_5dc0[0x1a];
                                        local_5ce0[0x1b] = (RTCHitN)local_5dc0[0x1b];
                                        local_5ce0[0x1c] = (RTCHitN)local_5dc0[0x1c];
                                        local_5ce0[0x1d] = (RTCHitN)local_5dc0[0x1d];
                                        local_5ce0[0x1e] = (RTCHitN)local_5dc0[0x1e];
                                        local_5ce0[0x1f] = (RTCHitN)local_5dc0[0x1f];
                                        local_5cc0 = local_5de0._0_8_;
                                        uStack_5cb8 = local_5de0._8_8_;
                                        uStack_5cb0 = local_5de0._16_8_;
                                        uStack_5ca8 = local_5de0._24_8_;
                                        local_5ca0 = local_5e00._0_8_;
                                        uStack_5c98 = local_5e00._8_8_;
                                        uStack_5c90 = local_5e00._16_8_;
                                        uStack_5c88 = local_5e00._24_8_;
                                        auVar68 = vpcmpeqd_avx2(local_5c80,local_5c80);
                                        local_5f28[1] = auVar68;
                                        *local_5f28 = auVar68;
                                        local_5c00 = pRVar10->instID[0];
                                        uStack_5bfc = local_5c00;
                                        uStack_5bf8 = local_5c00;
                                        uStack_5bf4 = local_5c00;
                                        uStack_5bf0 = local_5c00;
                                        uStack_5bec = local_5c00;
                                        uStack_5be8 = local_5c00;
                                        uStack_5be4 = local_5c00;
                                        local_5be0 = pRVar10->instPrimID[0];
                                        uStack_5bdc = local_5be0;
                                        uStack_5bd8 = local_5be0;
                                        uStack_5bd4 = local_5be0;
                                        uStack_5bd0 = local_5be0;
                                        uStack_5bcc = local_5be0;
                                        uStack_5bc8 = local_5be0;
                                        uStack_5bc4 = local_5be0;
                                        local_5d80 = *(int *)(ray + 0x100);
                                        iStack_5d7c = *(int *)(ray + 0x104);
                                        iStack_5d78 = *(int *)(ray + 0x108);
                                        iStack_5d74 = *(int *)(ray + 0x10c);
                                        iStack_5d70 = *(int *)(ray + 0x110);
                                        iStack_5d6c = *(int *)(ray + 0x114);
                                        iStack_5d68 = *(int *)(ray + 0x118);
                                        iStack_5d64 = *(int *)(ray + 0x11c);
                                        auVar68 = vmulps_avx512vl(ZEXT1632(auVar64),local_5da0);
                                        bVar60 = (bool)(bVar42 >> 1 & 1);
                                        bVar11 = (bool)(bVar42 >> 2 & 1);
                                        bVar12 = (bool)(bVar42 >> 3 & 1);
                                        bVar13 = (bool)(bVar42 >> 4 & 1);
                                        bVar14 = (bool)(bVar42 >> 5 & 1);
                                        bVar15 = (bool)(bVar42 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar42 & 1) * auVar68._0_4_ |
                                             (uint)!(bool)(bVar42 & 1) * local_5d80;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar60 * auVar68._4_4_ |
                                             (uint)!bVar60 * iStack_5d7c;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar11 * auVar68._8_4_ |
                                             (uint)!bVar11 * iStack_5d78;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar12 * auVar68._12_4_ |
                                             (uint)!bVar12 * iStack_5d74;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar13 * auVar68._16_4_ |
                                             (uint)!bVar13 * iStack_5d70;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar14 * auVar68._20_4_ |
                                             (uint)!bVar14 * iStack_5d6c;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar15 * auVar68._24_4_ |
                                             (uint)!bVar15 * iStack_5d68;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar42 >> 7) * auVar68._28_4_ |
                                             (uint)!(bool)(bVar42 >> 7) * iStack_5d64;
                                        local_5f20 = vpmovm2d_avx512vl((ulong)bVar42);
                                        local_5f80.geometryUserPtr = pGVar7->userPtr;
                                        local_5f80.valid = (int *)local_5f20;
                                        local_5f80.context = context->user;
                                        local_5f80.ray = (RTCRayN *)ray;
                                        local_5f80.hit = local_5ce0;
                                        local_5f80.N = 8;
                                        local_5f40 = vmovdqa64_avx512vl(auVar158);
                                        local_5f50 = vmovdqa64_avx512vl(auVar159._0_16_);
                                        local_5d00 = auVar72;
                                        local_5d20 = auVar73;
                                        local_5d40 = auVar74;
                                        local_5d60 = auVar71;
                                        local_5fb8 = lVar53;
                                        auVar152 = (undefined1  [36])0x0;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          auVar149 = (undefined1  [36])0x0;
                                          auVar152 = (undefined1  [36])0x0;
                                          local_5fa0 = lVar47;
                                          (*pGVar7->occlusionFilterN)(&local_5f80);
                                          auVar64 = vmovdqa64_avx512vl(local_5f50);
                                          auVar159 = ZEXT1664(auVar64);
                                          auVar64 = vmovdqa64_avx512vl(local_5f40);
                                          auVar138 = ZEXT1664(auVar64);
                                          in_ZMM25 = ZEXT3264(local_5f00);
                                          in_ZMM24 = ZEXT3264(local_5ee0);
                                          in_ZMM23 = ZEXT3264(local_5ec0);
                                          auVar65 = vxorps_avx512vl(auVar65,auVar65);
                                          auVar157 = ZEXT1664(auVar65);
                                          auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                          auVar156 = ZEXT1664(auVar62);
                                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar155 = ZEXT3264(auVar68);
                                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar154 = ZEXT3264(auVar68);
                                          lVar47 = local_5fa0;
                                          auVar104 = extraout_var;
                                        }
                                        auVar62 = auVar156._0_16_;
                                        auVar65 = auVar157._0_16_;
                                        uVar52 = vptestmd_avx512vl(local_5f20,local_5f20);
                                        if ((char)uVar52 != '\0') {
                                          p_Var9 = context->args->filter;
                                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            auVar149 = (undefined1  [36])0x0;
                                            auVar152 = (undefined1  [36])0x0;
                                            (*p_Var9)(&local_5f80);
                                            auVar64 = vmovdqa64_avx512vl(local_5f50);
                                            auVar159 = ZEXT1664(auVar64);
                                            auVar64 = vmovdqa64_avx512vl(local_5f40);
                                            auVar138 = ZEXT1664(auVar64);
                                            in_ZMM25 = ZEXT3264(local_5f00);
                                            in_ZMM24 = ZEXT3264(local_5ee0);
                                            in_ZMM23 = ZEXT3264(local_5ec0);
                                            auVar65 = vxorps_avx512vl(auVar65,auVar65);
                                            auVar157 = ZEXT1664(auVar65);
                                            auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                            auVar156 = ZEXT1664(auVar62);
                                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar155 = ZEXT3264(auVar68);
                                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar154 = ZEXT3264(auVar68);
                                            auVar104 = extraout_var_00;
                                          }
                                          uVar52 = vptestmd_avx512vl(local_5f20,local_5f20);
                                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar60 = (bool)((byte)uVar52 & 1);
                                          bVar11 = (bool)((byte)(uVar52 >> 1) & 1);
                                          bVar12 = (bool)((byte)(uVar52 >> 2) & 1);
                                          bVar13 = (bool)((byte)(uVar52 >> 3) & 1);
                                          bVar14 = (bool)((byte)(uVar52 >> 4) & 1);
                                          bVar15 = (bool)((byte)(uVar52 >> 5) & 1);
                                          bVar16 = (bool)((byte)(uVar52 >> 6) & 1);
                                          bVar17 = SUB81(uVar52 >> 7,0);
                                          *(uint *)(local_5f80.ray + 0x100) =
                                               (uint)bVar60 * auVar68._0_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x100);
                                          *(uint *)(local_5f80.ray + 0x104) =
                                               (uint)bVar11 * auVar68._4_4_ |
                                               (uint)!bVar11 * *(int *)(local_5f80.ray + 0x104);
                                          *(uint *)(local_5f80.ray + 0x108) =
                                               (uint)bVar12 * auVar68._8_4_ |
                                               (uint)!bVar12 * *(int *)(local_5f80.ray + 0x108);
                                          *(uint *)(local_5f80.ray + 0x10c) =
                                               (uint)bVar13 * auVar68._12_4_ |
                                               (uint)!bVar13 * *(int *)(local_5f80.ray + 0x10c);
                                          *(uint *)(local_5f80.ray + 0x110) =
                                               (uint)bVar14 * auVar68._16_4_ |
                                               (uint)!bVar14 * *(int *)(local_5f80.ray + 0x110);
                                          *(uint *)(local_5f80.ray + 0x114) =
                                               (uint)bVar15 * auVar68._20_4_ |
                                               (uint)!bVar15 * *(int *)(local_5f80.ray + 0x114);
                                          *(uint *)(local_5f80.ray + 0x118) =
                                               (uint)bVar16 * auVar68._24_4_ |
                                               (uint)!bVar16 * *(int *)(local_5f80.ray + 0x118);
                                          *(uint *)(local_5f80.ray + 0x11c) =
                                               (uint)bVar17 * auVar68._28_4_ |
                                               (uint)!bVar17 * *(int *)(local_5f80.ray + 0x11c);
                                        }
                                        bVar60 = (bool)((byte)uVar52 & 1);
                                        auVar83._0_4_ =
                                             (uint)bVar60 * *(int *)local_5f98 |
                                             (uint)!bVar60 * local_5d80;
                                        bVar60 = (bool)((byte)(uVar52 >> 1) & 1);
                                        auVar83._4_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 4) |
                                             (uint)!bVar60 * iStack_5d7c;
                                        bVar60 = (bool)((byte)(uVar52 >> 2) & 1);
                                        auVar83._8_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 8) |
                                             (uint)!bVar60 * iStack_5d78;
                                        bVar60 = (bool)((byte)(uVar52 >> 3) & 1);
                                        auVar83._12_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0xc) |
                                             (uint)!bVar60 * iStack_5d74;
                                        bVar60 = (bool)((byte)(uVar52 >> 4) & 1);
                                        auVar83._16_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x10) |
                                             (uint)!bVar60 * iStack_5d70;
                                        bVar60 = (bool)((byte)(uVar52 >> 5) & 1);
                                        auVar83._20_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x14) |
                                             (uint)!bVar60 * iStack_5d6c;
                                        bVar60 = (bool)((byte)(uVar52 >> 6) & 1);
                                        auVar83._24_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x18) |
                                             (uint)!bVar60 * iStack_5d68;
                                        bVar60 = SUB81(uVar52 >> 7,0);
                                        auVar83._28_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x1c) |
                                             (uint)!bVar60 * iStack_5d64;
                                        *(undefined1 (*) [32])local_5f98 = auVar83;
                                        lVar53 = local_5fb8;
                                        auVar72 = local_5d00;
                                        auVar73 = local_5d20;
                                        auVar74 = local_5d40;
                                        auVar71 = local_5d60;
                                      }
                                      auVar118 = ZEXT436(auVar83._28_4_);
                                      bVar48 = bVar48 & ~(byte)uVar52;
                                    }
                                  }
                                  auVar40._4_4_ = fStack_585c;
                                  auVar40._0_4_ = local_5860;
                                  auVar40._8_4_ = fStack_5858;
                                  auVar40._12_4_ = fStack_5854;
                                  auVar40._16_4_ = fStack_5850;
                                  auVar40._20_4_ = fStack_584c;
                                  auVar40._24_4_ = fStack_5848;
                                  auVar40._28_4_ = fStack_5844;
                                  auVar66 = vsubps_avx512vl(auVar72,auVar40);
                                  auVar39._4_4_ = fStack_587c;
                                  auVar39._0_4_ = local_5880;
                                  auVar39._8_4_ = fStack_5878;
                                  auVar39._12_4_ = fStack_5874;
                                  auVar39._16_4_ = fStack_5870;
                                  auVar39._20_4_ = fStack_586c;
                                  auVar39._24_4_ = fStack_5868;
                                  auVar39._28_4_ = fStack_5864;
                                  auVar70 = vsubps_avx512vl(auVar73,auVar39);
                                  auVar38._4_4_ = fStack_589c;
                                  auVar38._0_4_ = local_58a0;
                                  auVar38._8_4_ = fStack_5898;
                                  auVar38._12_4_ = fStack_5894;
                                  auVar38._16_4_ = fStack_5890;
                                  auVar38._20_4_ = fStack_588c;
                                  auVar38._24_4_ = fStack_5888;
                                  auVar38._28_4_ = fStack_5884;
                                  auVar84 = vsubps_avx512vl(auVar74,auVar38);
                                  auVar75 = vsubps_avx512vl(auVar71,auVar72);
                                  auVar76 = vsubps_avx512vl(_local_5ea0,auVar73);
                                  auVar41._4_4_ = fStack_583c;
                                  auVar41._0_4_ = local_5840;
                                  auVar41._8_4_ = fStack_5838;
                                  auVar41._12_4_ = fStack_5834;
                                  auVar41._16_4_ = fStack_5830;
                                  auVar41._20_4_ = fStack_582c;
                                  auVar41._24_4_ = fStack_5828;
                                  auVar41._28_4_ = fStack_5824;
                                  auVar77 = vsubps_avx512vl(auVar41,auVar74);
                                  auVar68 = vmulps_avx512vl(auVar70,auVar77);
                                  auVar65 = vfmsub231ps_fma(auVar68,auVar76,auVar84);
                                  auVar103._0_4_ = auVar84._0_4_ * auVar75._0_4_;
                                  auVar103._4_4_ = auVar84._4_4_ * auVar75._4_4_;
                                  auVar103._8_4_ = auVar84._8_4_ * auVar75._8_4_;
                                  auVar103._12_4_ = auVar84._12_4_ * auVar75._12_4_;
                                  auVar103._16_4_ = auVar84._16_4_ * auVar75._16_4_;
                                  auVar103._20_4_ = auVar84._20_4_ * auVar75._20_4_;
                                  auVar103._24_4_ = auVar84._24_4_ * auVar75._24_4_;
                                  auVar103._28_36_ = auVar104;
                                  auVar78 = vfmsub231ps_avx512vl(auVar103._0_32_,auVar77,auVar66);
                                  auVar111._0_4_ = auVar66._0_4_ * auVar76._0_4_;
                                  auVar111._4_4_ = auVar66._4_4_ * auVar76._4_4_;
                                  auVar111._8_4_ = auVar66._8_4_ * auVar76._8_4_;
                                  auVar111._12_4_ = auVar66._12_4_ * auVar76._12_4_;
                                  auVar111._16_4_ = auVar66._16_4_ * auVar76._16_4_;
                                  auVar111._20_4_ = auVar66._20_4_ * auVar76._20_4_;
                                  auVar111._24_4_ = auVar66._24_4_ * auVar76._24_4_;
                                  auVar111._28_36_ = auVar118;
                                  auVar64 = vfmsub231ps_fma(auVar111._0_32_,auVar75,auVar70);
                                  auVar72 = vsubps_avx512vl(auVar72,*(undefined1 (*) [32])ray);
                                  auVar73 = vsubps_avx512vl(auVar73,*(undefined1 (*) [32])
                                                                     (ray + 0x20));
                                  auVar74 = vsubps_avx512vl(auVar74,*(undefined1 (*) [32])
                                                                     (ray + 0x40));
                                  auVar68 = *(undefined1 (*) [32])(ray + 0x80);
                                  auVar67 = *(undefined1 (*) [32])(ray + 0xa0);
                                  auVar69 = *(undefined1 (*) [32])(ray + 0xc0);
                                  auVar85 = vmulps_avx512vl(auVar67,auVar74);
                                  auVar63 = vfmsub231ps_fma(auVar85,auVar73,auVar69);
                                  in_ZMM12 = ZEXT1664(auVar63);
                                  auVar148._0_4_ = auVar69._0_4_ * auVar72._0_4_;
                                  auVar148._4_4_ = auVar69._4_4_ * auVar72._4_4_;
                                  auVar148._8_4_ = auVar69._8_4_ * auVar72._8_4_;
                                  auVar148._12_4_ = auVar69._12_4_ * auVar72._12_4_;
                                  auVar148._16_4_ = auVar69._16_4_ * auVar72._16_4_;
                                  auVar148._20_4_ = auVar69._20_4_ * auVar72._20_4_;
                                  auVar148._24_4_ = auVar69._24_4_ * auVar72._24_4_;
                                  auVar148._28_36_ = auVar149;
                                  auVar160 = vfmsub231ps_fma(auVar148._0_32_,auVar74,auVar68);
                                  in_ZMM13 = ZEXT1664(auVar160);
                                  auVar151._0_4_ = auVar68._0_4_ * auVar73._0_4_;
                                  auVar151._4_4_ = auVar68._4_4_ * auVar73._4_4_;
                                  auVar151._8_4_ = auVar68._8_4_ * auVar73._8_4_;
                                  auVar151._12_4_ = auVar68._12_4_ * auVar73._12_4_;
                                  auVar151._16_4_ = auVar68._16_4_ * auVar73._16_4_;
                                  auVar151._20_4_ = auVar68._20_4_ * auVar73._20_4_;
                                  auVar151._24_4_ = auVar68._24_4_ * auVar73._24_4_;
                                  auVar151._28_36_ = auVar152;
                                  auVar85 = vfmsub231ps_avx512vl(auVar151._0_32_,auVar72,auVar67);
                                  in_ZMM14 = ZEXT3264(auVar85);
                                  auVar29._4_4_ = auVar64._4_4_ * auVar69._4_4_;
                                  auVar29._0_4_ = auVar64._0_4_ * auVar69._0_4_;
                                  auVar29._8_4_ = auVar64._8_4_ * auVar69._8_4_;
                                  auVar29._12_4_ = auVar64._12_4_ * auVar69._12_4_;
                                  auVar29._16_4_ = auVar69._16_4_ * 0.0;
                                  auVar29._20_4_ = auVar69._20_4_ * 0.0;
                                  auVar29._24_4_ = auVar69._24_4_ * 0.0;
                                  auVar29._28_4_ = auVar69._28_4_;
                                  auVar67 = vfmadd231ps_avx512vl(auVar29,auVar78,auVar67);
                                  auVar62 = vfmadd231ps_fma(auVar67,ZEXT1632(auVar65),auVar68);
                                  vandps_avx512vl(ZEXT1632(auVar62),auVar155._0_32_);
                                  auVar68 = vmulps_avx512vl(auVar77,auVar85);
                                  auVar68 = vfmadd231ps_avx512vl(auVar68,ZEXT1632(auVar160),auVar76)
                                  ;
                                  auVar68 = vfmadd231ps_avx512vl(auVar68,ZEXT1632(auVar63),auVar75);
                                  auVar68 = vxorps_avx512vl(auVar67,auVar68);
                                  uVar18 = vcmpps_avx512vl(auVar68,auVar156._0_32_,5);
                                  bVar42 = (byte)uVar18 & bVar48;
                                  if (bVar42 == 0) {
LAB_0088b822:
                                    uVar44 = 0;
                                  }
                                  else {
                                    auVar33._4_4_ = auVar84._4_4_ * auVar85._4_4_;
                                    auVar33._0_4_ = auVar84._0_4_ * auVar85._0_4_;
                                    auVar33._8_4_ = auVar84._8_4_ * auVar85._8_4_;
                                    auVar33._12_4_ = auVar84._12_4_ * auVar85._12_4_;
                                    auVar33._16_4_ = auVar84._16_4_ * auVar85._16_4_;
                                    auVar33._20_4_ = auVar84._20_4_ * auVar85._20_4_;
                                    auVar33._24_4_ = auVar84._24_4_ * auVar85._24_4_;
                                    auVar33._28_4_ = auVar84._28_4_;
                                    auVar160 = vfmadd213ps_fma(ZEXT1632(auVar160),auVar70,auVar33);
                                    in_ZMM13 = ZEXT1664(auVar160);
                                    auVar63 = vfmadd213ps_fma(ZEXT1632(auVar63),auVar66,
                                                              ZEXT1632(auVar160));
                                    in_ZMM12 = ZEXT1664(auVar63);
                                    auVar137._0_4_ = auVar67._0_4_ ^ auVar63._0_4_;
                                    auVar137._4_4_ = auVar67._4_4_ ^ auVar63._4_4_;
                                    auVar137._8_4_ = auVar67._8_4_ ^ auVar63._8_4_;
                                    auVar137._12_4_ = auVar67._12_4_ ^ auVar63._12_4_;
                                    auVar137._16_4_ = auVar67._16_4_;
                                    auVar137._20_4_ = auVar67._20_4_;
                                    auVar137._24_4_ = auVar67._24_4_;
                                    auVar137._28_4_ = auVar67._28_4_;
                                    uVar18 = vcmpps_avx512vl(auVar137,auVar156._0_32_,5);
                                    bVar42 = bVar42 & (byte)uVar18;
                                    if (bVar42 == 0) goto LAB_0088b822;
                                    auVar25._8_4_ = 0x7fffffff;
                                    auVar25._0_8_ = 0x7fffffff7fffffff;
                                    auVar25._12_4_ = 0x7fffffff;
                                    auVar25._16_4_ = 0x7fffffff;
                                    auVar25._20_4_ = 0x7fffffff;
                                    auVar25._24_4_ = 0x7fffffff;
                                    auVar25._28_4_ = 0x7fffffff;
                                    vandps_avx512vl(ZEXT1632(auVar62),auVar25);
                                    auVar69 = vsubps_avx(auVar68,auVar68);
                                    uVar18 = vcmpps_avx512vl(auVar69,auVar137,5);
                                    bVar42 = bVar42 & (byte)uVar18;
                                    if (bVar42 == 0) goto LAB_0088b822;
                                    auVar34._4_4_ = auVar64._4_4_ * auVar74._4_4_;
                                    auVar34._0_4_ = auVar64._0_4_ * auVar74._0_4_;
                                    auVar34._8_4_ = auVar64._8_4_ * auVar74._8_4_;
                                    auVar34._12_4_ = auVar64._12_4_ * auVar74._12_4_;
                                    auVar34._16_4_ = auVar74._16_4_ * 0.0;
                                    auVar34._20_4_ = auVar74._20_4_ * 0.0;
                                    auVar34._24_4_ = auVar74._24_4_ * 0.0;
                                    auVar34._28_4_ = auVar74._28_4_;
                                    auVar63 = vfmadd213ps_fma(auVar73,auVar78,auVar34);
                                    auVar63 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar65),
                                                              ZEXT1632(auVar63));
                                    auVar129._0_4_ = auVar68._0_4_ * *(float *)(ray + 0x60);
                                    auVar129._4_4_ = auVar68._4_4_ * *(float *)(ray + 100);
                                    auVar129._8_4_ = auVar68._8_4_ * *(float *)(ray + 0x68);
                                    auVar129._12_4_ = auVar68._12_4_ * *(float *)(ray + 0x6c);
                                    auVar129._16_4_ = auVar68._16_4_ * *(float *)(ray + 0x70);
                                    auVar129._20_4_ = auVar68._20_4_ * *(float *)(ray + 0x74);
                                    auVar129._24_4_ = auVar68._24_4_ * *(float *)(ray + 0x78);
                                    auVar129._28_4_ = 0;
                                    auVar122._0_4_ = auVar67._0_4_ ^ auVar63._0_4_;
                                    auVar122._4_4_ = auVar67._4_4_ ^ auVar63._4_4_;
                                    auVar122._8_4_ = auVar67._8_4_ ^ auVar63._8_4_;
                                    auVar122._12_4_ = auVar67._12_4_ ^ auVar63._12_4_;
                                    auVar122._16_4_ = auVar67._16_4_;
                                    auVar122._20_4_ = auVar67._20_4_;
                                    auVar122._24_4_ = auVar67._24_4_;
                                    auVar122._28_4_ = auVar67._28_4_;
                                    auVar35._4_4_ = auVar68._4_4_ * *(float *)(ray + 0x104);
                                    auVar35._0_4_ = auVar68._0_4_ * *(float *)(ray + 0x100);
                                    auVar35._8_4_ = auVar68._8_4_ * *(float *)(ray + 0x108);
                                    auVar35._12_4_ = auVar68._12_4_ * *(float *)(ray + 0x10c);
                                    auVar35._16_4_ = auVar68._16_4_ * *(float *)(ray + 0x110);
                                    auVar35._20_4_ = auVar68._20_4_ * *(float *)(ray + 0x114);
                                    auVar35._24_4_ = auVar68._24_4_ * *(float *)(ray + 0x118);
                                    auVar35._28_4_ = auVar74._28_4_;
                                    uVar18 = vcmpps_avx512vl(auVar122,auVar35,2);
                                    uVar19 = vcmpps_avx512vl(auVar129,auVar122,1);
                                    bVar42 = bVar42 & (byte)uVar18 & (byte)uVar19;
                                    if (bVar42 == 0) {
                                      uVar44 = 0;
                                    }
                                    else {
                                      uVar18 = vcmpps_avx512vl(ZEXT1632(auVar62),ZEXT832(0) << 0x20,
                                                               4);
                                      bVar42 = bVar42 & (byte)uVar18;
                                      uVar44 = (uint)bVar42;
                                      if (bVar42 != 0) {
                                        in_ZMM23 = ZEXT3264(auVar68);
                                        in_ZMM24 = ZEXT3264(auVar137);
                                        local_5da0 = auVar122;
                                        in_ZMM25 = ZEXT3264(auVar68);
                                        local_5dc0 = ZEXT1632(auVar65);
                                        local_5de0 = auVar78;
                                        local_5e00 = ZEXT1632(auVar64);
                                      }
                                    }
                                    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar154 = ZEXT3264(auVar68);
                                    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar155 = ZEXT3264(auVar68);
                                    auVar62 = vxorps_avx512vl(auVar156._0_16_,auVar156._0_16_);
                                    auVar156 = ZEXT1664(auVar62);
                                    auVar62 = vxorps_avx512vl(auVar157._0_16_,auVar157._0_16_);
                                    auVar157 = ZEXT1664(auVar62);
                                  }
                                  auVar62 = auVar156._0_16_;
                                  auVar65 = auVar157._0_16_;
                                  bVar42 = (byte)uVar44;
                                  if (bVar42 != 0) {
                                    local_5f00 = in_ZMM25._0_32_;
                                    auVar68 = vsubps_avx512vl(local_5f00,in_ZMM23._0_32_);
                                    auVar67 = vsubps_avx512vl(local_5f00,in_ZMM24._0_32_);
                                    auVar160 = auVar71._0_16_;
                                    auVar64 = vcvtsi2ss_avx512f(auVar160,*(ushort *)
                                                                          (lVar53 + 8 + lVar47) - 1)
                                    ;
                                    auVar87._16_16_ = auVar67._16_16_;
                                    auVar87._0_16_ = auVar65;
                                    auVar86._4_28_ = auVar87._4_28_;
                                    auVar86._0_4_ = auVar64._0_4_;
                                    auVar63 = vrcp14ss_avx512f(auVar65,auVar86._0_16_);
                                    auVar64 = vfnmadd213ss_avx512f
                                                        (auVar64,auVar63,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar113 = auVar63._0_4_ * auVar64._0_4_;
                                    auVar64 = vcvtsi2ss_avx512f(auVar160,*(ushort *)
                                                                          (lVar53 + 10 + lVar47) - 1
                                                               );
                                    auVar89._16_16_ = auVar87._16_16_;
                                    auVar89._0_16_ = auVar65;
                                    auVar88._4_28_ = auVar89._4_28_;
                                    auVar88._0_4_ = auVar64._0_4_;
                                    auVar63 = vrcp14ss_avx512f(auVar65,auVar88._0_16_);
                                    auVar64 = vfnmadd213ss_avx512f
                                                        (auVar64,auVar63,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar114 = auVar63._0_4_ * auVar64._0_4_;
                                    auVar64 = vcvtsi2ss_avx512f(auVar160,((uint)uVar61 & 1) +
                                                                         local_5fac);
                                    auVar110._0_4_ = auVar64._0_4_;
                                    auVar110._4_4_ = auVar110._0_4_;
                                    auVar110._8_4_ = auVar110._0_4_;
                                    auVar110._12_4_ = auVar110._0_4_;
                                    auVar110._16_4_ = auVar110._0_4_;
                                    auVar110._20_4_ = auVar110._0_4_;
                                    auVar110._24_4_ = auVar110._0_4_;
                                    auVar110._28_4_ = auVar110._0_4_;
                                    auVar69 = vmulps_avx512vl(auVar110,local_5f00);
                                    auVar69 = vaddps_avx512vl(auVar68,auVar69);
                                    auVar97._4_4_ = fVar113;
                                    auVar97._0_4_ = fVar113;
                                    auVar97._8_4_ = fVar113;
                                    auVar97._12_4_ = fVar113;
                                    auVar97._16_4_ = fVar113;
                                    auVar97._20_4_ = fVar113;
                                    auVar97._24_4_ = fVar113;
                                    auVar97._28_4_ = fVar113;
                                    auVar69 = vmulps_avx512vl(auVar69,auVar97);
                                    local_5ec0._0_4_ =
                                         (uint)(bVar42 & 1) * auVar69._0_4_ |
                                         (uint)!(bool)(bVar42 & 1) * auVar68._0_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 1) & 1);
                                    local_5ec0._4_4_ =
                                         (uint)bVar60 * auVar69._4_4_ |
                                         (uint)!bVar60 * auVar68._4_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 2) & 1);
                                    local_5ec0._8_4_ =
                                         (uint)bVar60 * auVar69._8_4_ |
                                         (uint)!bVar60 * auVar68._8_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 3) & 1);
                                    local_5ec0._12_4_ =
                                         (uint)bVar60 * auVar69._12_4_ |
                                         (uint)!bVar60 * auVar68._12_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 4) & 1);
                                    local_5ec0._16_4_ =
                                         (uint)bVar60 * auVar69._16_4_ |
                                         (uint)!bVar60 * auVar68._16_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 5) & 1);
                                    local_5ec0._20_4_ =
                                         (uint)bVar60 * auVar69._20_4_ |
                                         (uint)!bVar60 * auVar68._20_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 6) & 1);
                                    local_5ec0._24_4_ =
                                         (uint)bVar60 * auVar69._24_4_ |
                                         (uint)!bVar60 * auVar68._24_4_;
                                    local_5ec0._28_4_ =
                                         (uVar44 >> 7) * auVar69._28_4_ |
                                         (uint)!SUB41(uVar44 >> 7,0) * auVar68._28_4_;
                                    in_ZMM23 = ZEXT3264(local_5ec0);
                                    auVar64 = vcvtsi2ss_avx512f(auVar160,((uint)(uVar61 >> 1) &
                                                                         0x7fffffff) + local_5fb0);
                                    auVar98._0_4_ = auVar64._0_4_;
                                    auVar98._4_4_ = auVar98._0_4_;
                                    auVar98._8_4_ = auVar98._0_4_;
                                    auVar98._12_4_ = auVar98._0_4_;
                                    auVar98._16_4_ = auVar98._0_4_;
                                    auVar98._20_4_ = auVar98._0_4_;
                                    auVar98._24_4_ = auVar98._0_4_;
                                    auVar98._28_4_ = auVar98._0_4_;
                                    auVar68 = vmulps_avx512vl(auVar98,local_5f00);
                                    auVar68 = vaddps_avx512vl(auVar67,auVar68);
                                    auVar102._4_4_ = fVar114;
                                    auVar102._0_4_ = fVar114;
                                    auVar102._8_4_ = fVar114;
                                    auVar102._12_4_ = fVar114;
                                    auVar102._16_4_ = fVar114;
                                    auVar102._20_4_ = fVar114;
                                    auVar102._24_4_ = fVar114;
                                    auVar102._28_4_ = fVar114;
                                    auVar68 = vmulps_avx512vl(auVar68,auVar102);
                                    local_5ee0._0_4_ =
                                         (uint)(bVar42 & 1) * auVar68._0_4_ |
                                         (uint)!(bool)(bVar42 & 1) * auVar67._0_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 1) & 1);
                                    local_5ee0._4_4_ =
                                         (uint)bVar60 * auVar68._4_4_ |
                                         (uint)!bVar60 * auVar67._4_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 2) & 1);
                                    local_5ee0._8_4_ =
                                         (uint)bVar60 * auVar68._8_4_ |
                                         (uint)!bVar60 * auVar67._8_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 3) & 1);
                                    local_5ee0._12_4_ =
                                         (uint)bVar60 * auVar68._12_4_ |
                                         (uint)!bVar60 * auVar67._12_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 4) & 1);
                                    local_5ee0._16_4_ =
                                         (uint)bVar60 * auVar68._16_4_ |
                                         (uint)!bVar60 * auVar67._16_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 5) & 1);
                                    local_5ee0._20_4_ =
                                         (uint)bVar60 * auVar68._20_4_ |
                                         (uint)!bVar60 * auVar67._20_4_;
                                    bVar60 = (bool)((byte)(uVar44 >> 6) & 1);
                                    local_5ee0._24_4_ =
                                         (uint)bVar60 * auVar68._24_4_ |
                                         (uint)!bVar60 * auVar67._24_4_;
                                    local_5ee0._28_4_ =
                                         (uVar44 >> 7) * auVar68._28_4_ |
                                         (uint)!SUB41(uVar44 >> 7,0) * auVar67._28_4_;
                                    in_ZMM24 = ZEXT3264(local_5ee0);
                                    pGVar7 = (context->scene->geometries).items
                                             [*(uint *)(local_5e20 + uVar61 * 4)].ptr;
                                    uVar44 = pGVar7->mask;
                                    auVar99._4_4_ = uVar44;
                                    auVar99._0_4_ = uVar44;
                                    auVar99._8_4_ = uVar44;
                                    auVar99._12_4_ = uVar44;
                                    auVar99._16_4_ = uVar44;
                                    auVar99._20_4_ = uVar44;
                                    auVar99._24_4_ = uVar44;
                                    auVar99._28_4_ = uVar44;
                                    uVar18 = vptestmd_avx512vl(auVar99,*(undefined1 (*) [32])
                                                                        (ray + 0x120));
                                    bVar42 = (byte)uVar18 & bVar42;
                                    uVar52 = (ulong)bVar42;
                                    if (bVar42 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar68 = vrcp14ps_avx512vl(local_5f00);
                                        auVar24._8_4_ = 0x3f800000;
                                        auVar24._0_8_ = &DAT_3f8000003f800000;
                                        auVar24._12_4_ = 0x3f800000;
                                        auVar24._16_4_ = 0x3f800000;
                                        auVar24._20_4_ = 0x3f800000;
                                        auVar24._24_4_ = 0x3f800000;
                                        auVar24._28_4_ = 0x3f800000;
                                        auVar67 = vfnmadd213ps_avx512vl(auVar68,local_5f00,auVar24);
                                        auVar64 = vfmadd132ps_fma(auVar67,auVar68,auVar68);
                                        local_5c80 = vmulps_avx512vl(local_5ec0,ZEXT1632(auVar64));
                                        local_5c60 = vmulps_avx512vl(local_5ee0,ZEXT1632(auVar64));
                                        pRVar10 = context->user;
                                        local_5c20 = vpbroadcastd_avx512vl();
                                        local_5c40 = vpbroadcastd_avx512vl();
                                        local_5ce0[0] = (RTCHitN)local_5dc0[0];
                                        local_5ce0[1] = (RTCHitN)local_5dc0[1];
                                        local_5ce0[2] = (RTCHitN)local_5dc0[2];
                                        local_5ce0[3] = (RTCHitN)local_5dc0[3];
                                        local_5ce0[4] = (RTCHitN)local_5dc0[4];
                                        local_5ce0[5] = (RTCHitN)local_5dc0[5];
                                        local_5ce0[6] = (RTCHitN)local_5dc0[6];
                                        local_5ce0[7] = (RTCHitN)local_5dc0[7];
                                        local_5ce0[8] = (RTCHitN)local_5dc0[8];
                                        local_5ce0[9] = (RTCHitN)local_5dc0[9];
                                        local_5ce0[10] = (RTCHitN)local_5dc0[10];
                                        local_5ce0[0xb] = (RTCHitN)local_5dc0[0xb];
                                        local_5ce0[0xc] = (RTCHitN)local_5dc0[0xc];
                                        local_5ce0[0xd] = (RTCHitN)local_5dc0[0xd];
                                        local_5ce0[0xe] = (RTCHitN)local_5dc0[0xe];
                                        local_5ce0[0xf] = (RTCHitN)local_5dc0[0xf];
                                        local_5ce0[0x10] = (RTCHitN)local_5dc0[0x10];
                                        local_5ce0[0x11] = (RTCHitN)local_5dc0[0x11];
                                        local_5ce0[0x12] = (RTCHitN)local_5dc0[0x12];
                                        local_5ce0[0x13] = (RTCHitN)local_5dc0[0x13];
                                        local_5ce0[0x14] = (RTCHitN)local_5dc0[0x14];
                                        local_5ce0[0x15] = (RTCHitN)local_5dc0[0x15];
                                        local_5ce0[0x16] = (RTCHitN)local_5dc0[0x16];
                                        local_5ce0[0x17] = (RTCHitN)local_5dc0[0x17];
                                        local_5ce0[0x18] = (RTCHitN)local_5dc0[0x18];
                                        local_5ce0[0x19] = (RTCHitN)local_5dc0[0x19];
                                        local_5ce0[0x1a] = (RTCHitN)local_5dc0[0x1a];
                                        local_5ce0[0x1b] = (RTCHitN)local_5dc0[0x1b];
                                        local_5ce0[0x1c] = (RTCHitN)local_5dc0[0x1c];
                                        local_5ce0[0x1d] = (RTCHitN)local_5dc0[0x1d];
                                        local_5ce0[0x1e] = (RTCHitN)local_5dc0[0x1e];
                                        local_5ce0[0x1f] = (RTCHitN)local_5dc0[0x1f];
                                        local_5cc0 = local_5de0._0_8_;
                                        uStack_5cb8 = local_5de0._8_8_;
                                        uStack_5cb0 = local_5de0._16_8_;
                                        uStack_5ca8 = local_5de0._24_8_;
                                        local_5ca0 = local_5e00._0_8_;
                                        uStack_5c98 = local_5e00._8_8_;
                                        uStack_5c90 = local_5e00._16_8_;
                                        uStack_5c88 = local_5e00._24_8_;
                                        auVar68 = vpcmpeqd_avx2(local_5c80,local_5c80);
                                        local_5f28[1] = auVar68;
                                        *local_5f28 = auVar68;
                                        local_5c00 = pRVar10->instID[0];
                                        uStack_5bfc = local_5c00;
                                        uStack_5bf8 = local_5c00;
                                        uStack_5bf4 = local_5c00;
                                        uStack_5bf0 = local_5c00;
                                        uStack_5bec = local_5c00;
                                        uStack_5be8 = local_5c00;
                                        uStack_5be4 = local_5c00;
                                        local_5be0 = pRVar10->instPrimID[0];
                                        uStack_5bdc = local_5be0;
                                        uStack_5bd8 = local_5be0;
                                        uStack_5bd4 = local_5be0;
                                        uStack_5bd0 = local_5be0;
                                        uStack_5bcc = local_5be0;
                                        uStack_5bc8 = local_5be0;
                                        uStack_5bc4 = local_5be0;
                                        iVar45 = *(int *)(ray + 0x100);
                                        iVar112 = *(int *)(ray + 0x104);
                                        fVar113 = *(float *)(ray + 0x108);
                                        fVar114 = *(float *)(ray + 0x10c);
                                        fVar115 = *(float *)(ray + 0x110);
                                        fVar116 = *(float *)(ray + 0x114);
                                        fVar105 = *(float *)(ray + 0x118);
                                        fVar117 = *(float *)(ray + 0x11c);
                                        _local_5ea0 = *(undefined1 (*) [32])(ray + 0x100);
                                        auVar68 = vmulps_avx512vl(ZEXT1632(auVar64),local_5da0);
                                        bVar60 = (bool)(bVar42 >> 1 & 1);
                                        bVar11 = (bool)(bVar42 >> 2 & 1);
                                        bVar12 = (bool)(bVar42 >> 3 & 1);
                                        bVar13 = (bool)(bVar42 >> 4 & 1);
                                        bVar14 = (bool)(bVar42 >> 5 & 1);
                                        bVar15 = (bool)(bVar42 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar42 & 1) * auVar68._0_4_ |
                                             (uint)!(bool)(bVar42 & 1) * iVar45;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar60 * auVar68._4_4_ | (uint)!bVar60 * iVar112;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar11 * auVar68._8_4_ |
                                             (uint)!bVar11 * (int)fVar113;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar12 * auVar68._12_4_ |
                                             (uint)!bVar12 * (int)fVar114;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar13 * auVar68._16_4_ |
                                             (uint)!bVar13 * (int)fVar115;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar14 * auVar68._20_4_ |
                                             (uint)!bVar14 * (int)fVar116;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar15 * auVar68._24_4_ |
                                             (uint)!bVar15 * (int)fVar105;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar42 >> 7) * auVar68._28_4_ |
                                             (uint)!(bool)(bVar42 >> 7) * (int)fVar117;
                                        local_5f20 = vpmovm2d_avx512vl((ulong)bVar42);
                                        local_5f80.geometryUserPtr = pGVar7->userPtr;
                                        local_5f80.valid = (int *)local_5f20;
                                        local_5f80.context = context->user;
                                        local_5f80.ray = (RTCRayN *)ray;
                                        local_5f80.hit = local_5ce0;
                                        local_5f80.N = 8;
                                        local_5f40 = vmovdqa64_avx512vl(auVar138._0_16_);
                                        local_5f50 = vmovdqa64_avx512vl(auVar159._0_16_);
                                        local_5fb8 = lVar53;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                          in_ZMM14 = ZEXT1664(auVar85._0_16_);
                                          local_5fa0 = lVar47;
                                          (*pGVar7->occlusionFilterN)(&local_5f80);
                                          auVar64 = vmovdqa64_avx512vl(local_5f50);
                                          auVar159 = ZEXT1664(auVar64);
                                          auVar64 = vmovdqa64_avx512vl(local_5f40);
                                          auVar138 = ZEXT1664(auVar64);
                                          in_ZMM25 = ZEXT3264(local_5f00);
                                          in_ZMM24 = ZEXT3264(local_5ee0);
                                          in_ZMM23 = ZEXT3264(local_5ec0);
                                          auVar65 = vxorps_avx512vl(auVar65,auVar65);
                                          auVar157 = ZEXT1664(auVar65);
                                          auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                          auVar156 = ZEXT1664(auVar62);
                                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar155 = ZEXT3264(auVar68);
                                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar154 = ZEXT3264(auVar68);
                                          lVar47 = local_5fa0;
                                          iVar45 = local_5ea0._0_4_;
                                          iVar112 = local_5ea0._4_4_;
                                          fVar113 = fStack_5e98;
                                          fVar114 = fStack_5e94;
                                          fVar115 = fStack_5e90;
                                          fVar116 = fStack_5e8c;
                                          fVar105 = fStack_5e88;
                                          fVar117 = fStack_5e84;
                                        }
                                        auVar62 = auVar156._0_16_;
                                        auVar65 = auVar157._0_16_;
                                        uVar52 = vptestmd_avx512vl(local_5f20,local_5f20);
                                        if ((char)uVar52 != '\0') {
                                          p_Var9 = context->args->filter;
                                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                            (*p_Var9)(&local_5f80);
                                            auVar64 = vmovdqa64_avx512vl(local_5f50);
                                            auVar159 = ZEXT1664(auVar64);
                                            auVar64 = vmovdqa64_avx512vl(local_5f40);
                                            auVar138 = ZEXT1664(auVar64);
                                            in_ZMM25 = ZEXT3264(local_5f00);
                                            in_ZMM24 = ZEXT3264(local_5ee0);
                                            in_ZMM23 = ZEXT3264(local_5ec0);
                                            auVar65 = vxorps_avx512vl(auVar65,auVar65);
                                            auVar157 = ZEXT1664(auVar65);
                                            auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                            auVar156 = ZEXT1664(auVar62);
                                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar155 = ZEXT3264(auVar68);
                                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar154 = ZEXT3264(auVar68);
                                            iVar45 = local_5ea0._0_4_;
                                            iVar112 = local_5ea0._4_4_;
                                            fVar113 = fStack_5e98;
                                            fVar114 = fStack_5e94;
                                            fVar115 = fStack_5e90;
                                            fVar116 = fStack_5e8c;
                                            fVar105 = fStack_5e88;
                                            fVar117 = fStack_5e84;
                                          }
                                          uVar52 = vptestmd_avx512vl(local_5f20,local_5f20);
                                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar60 = (bool)((byte)uVar52 & 1);
                                          auVar90._0_4_ =
                                               (uint)bVar60 * auVar68._0_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x100);
                                          bVar60 = (bool)((byte)(uVar52 >> 1) & 1);
                                          auVar90._4_4_ =
                                               (uint)bVar60 * auVar68._4_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x104);
                                          bVar60 = (bool)((byte)(uVar52 >> 2) & 1);
                                          auVar90._8_4_ =
                                               (uint)bVar60 * auVar68._8_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x108);
                                          bVar60 = (bool)((byte)(uVar52 >> 3) & 1);
                                          auVar90._12_4_ =
                                               (uint)bVar60 * auVar68._12_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x10c);
                                          bVar60 = (bool)((byte)(uVar52 >> 4) & 1);
                                          auVar90._16_4_ =
                                               (uint)bVar60 * auVar68._16_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x110);
                                          bVar60 = (bool)((byte)(uVar52 >> 5) & 1);
                                          auVar90._20_4_ =
                                               (uint)bVar60 * auVar68._20_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x114);
                                          bVar60 = (bool)((byte)(uVar52 >> 6) & 1);
                                          auVar90._24_4_ =
                                               (uint)bVar60 * auVar68._24_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x118);
                                          bVar60 = SUB81(uVar52 >> 7,0);
                                          auVar90._28_4_ =
                                               (uint)bVar60 * auVar68._28_4_ |
                                               (uint)!bVar60 * *(int *)(local_5f80.ray + 0x11c);
                                          *(undefined1 (*) [32])(local_5f80.ray + 0x100) = auVar90;
                                        }
                                        bVar60 = (bool)((byte)uVar52 & 1);
                                        auVar91._0_4_ =
                                             (uint)bVar60 * *(int *)local_5f98 |
                                             (uint)!bVar60 * iVar45;
                                        bVar60 = (bool)((byte)(uVar52 >> 1) & 1);
                                        auVar91._4_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 4) |
                                             (uint)!bVar60 * iVar112;
                                        bVar60 = (bool)((byte)(uVar52 >> 2) & 1);
                                        auVar91._8_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 8) |
                                             (uint)!bVar60 * (int)fVar113;
                                        bVar60 = (bool)((byte)(uVar52 >> 3) & 1);
                                        auVar91._12_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0xc) |
                                             (uint)!bVar60 * (int)fVar114;
                                        bVar60 = (bool)((byte)(uVar52 >> 4) & 1);
                                        auVar91._16_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x10) |
                                             (uint)!bVar60 * (int)fVar115;
                                        bVar60 = (bool)((byte)(uVar52 >> 5) & 1);
                                        auVar91._20_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x14) |
                                             (uint)!bVar60 * (int)fVar116;
                                        bVar60 = (bool)((byte)(uVar52 >> 6) & 1);
                                        auVar91._24_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x18) |
                                             (uint)!bVar60 * (int)fVar105;
                                        bVar60 = SUB81(uVar52 >> 7,0);
                                        auVar91._28_4_ =
                                             (uint)bVar60 * *(int *)(local_5f98 + 0x1c) |
                                             (uint)!bVar60 * (int)fVar117;
                                        *(undefined1 (*) [32])local_5f98 = auVar91;
                                        lVar53 = local_5fb8;
                                      }
                                      bVar48 = bVar48 & ~(byte)uVar52;
                                    }
                                  }
                                  if (bVar48 == 0) break;
                                  pfVar51 = pfVar51 + 0x10;
                                  bVar60 = uVar61 < 3;
                                  uVar61 = uVar61 + 1;
                                } while (bVar60);
                                bVar55 = bVar55 & bVar48;
                                bVar60 = bVar55 == 0;
                                lVar49 = local_5e50;
                                uVar52 = local_5e48;
                                uVar61 = local_5f90;
                                puVar54 = local_5fa8;
                              }
                            } while ((!bVar60) && (uVar52 = uVar52 - 1 & uVar52, uVar52 != 0));
                          }
                          lVar49 = local_5e58 + 1;
                        } while (lVar49 != local_5e60);
                        bVar55 = ~bVar55;
                      }
                      bVar43 = bVar43 | bVar55;
                      if (bVar43 == 0xff) goto LAB_0088c27d;
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_59c0._0_4_ =
                           (uint)(bVar43 & 1) * auVar68._0_4_ |
                           (uint)!(bool)(bVar43 & 1) * local_59c0._0_4_;
                      bVar60 = (bool)(bVar43 >> 1 & 1);
                      local_59c0._4_4_ =
                           (uint)bVar60 * auVar68._4_4_ | (uint)!bVar60 * local_59c0._4_4_;
                      bVar60 = (bool)(bVar43 >> 2 & 1);
                      local_59c0._8_4_ =
                           (uint)bVar60 * auVar68._8_4_ | (uint)!bVar60 * local_59c0._8_4_;
                      bVar60 = (bool)(bVar43 >> 3 & 1);
                      local_59c0._12_4_ =
                           (uint)bVar60 * auVar68._12_4_ | (uint)!bVar60 * local_59c0._12_4_;
                      bVar60 = (bool)(bVar43 >> 4 & 1);
                      local_59c0._16_4_ =
                           (uint)bVar60 * auVar68._16_4_ | (uint)!bVar60 * local_59c0._16_4_;
                      bVar60 = (bool)(bVar43 >> 5 & 1);
                      local_59c0._20_4_ =
                           (uint)bVar60 * auVar68._20_4_ | (uint)!bVar60 * local_59c0._20_4_;
                      bVar60 = (bool)(bVar43 >> 6 & 1);
                      local_59c0._24_4_ =
                           (uint)bVar60 * auVar68._24_4_ | (uint)!bVar60 * local_59c0._24_4_;
                      local_59c0._28_4_ =
                           (uint)(bVar43 >> 7) * auVar68._28_4_ |
                           (uint)!(bool)(bVar43 >> 7) * local_59c0._28_4_;
                      iVar45 = 0;
                      break;
                    }
                    goto LAB_0088c28e;
                  }
                  auVar138 = ZEXT3264(auVar154._0_32_);
                  uVar58 = 0;
                  uVar52 = 8;
                  do {
                    uVar46 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar58 * 8);
                    if (uVar46 != 8) {
                      auVar36._4_4_ = fStack_5a9c;
                      auVar36._0_4_ = local_5aa0;
                      auVar36._8_4_ = fStack_5a98;
                      auVar36._12_4_ = fStack_5a94;
                      auVar36._16_4_ = fStack_5a90;
                      auVar36._20_4_ = fStack_5a8c;
                      auVar36._24_4_ = fStack_5a88;
                      auVar36._28_4_ = uStack_5a84;
                      uVar59 = *(undefined4 *)(root.ptr + 0x40 + uVar58 * 4);
                      auVar123._4_4_ = uVar59;
                      auVar123._0_4_ = uVar59;
                      auVar123._8_4_ = uVar59;
                      auVar123._12_4_ = uVar59;
                      auVar123._16_4_ = uVar59;
                      auVar123._20_4_ = uVar59;
                      auVar123._24_4_ = uVar59;
                      auVar123._28_4_ = uVar59;
                      auVar62 = vfmsub132ps_fma(auVar123,auVar36,local_5b00);
                      auVar37._4_4_ = fStack_5a7c;
                      auVar37._0_4_ = local_5a80;
                      auVar37._8_4_ = fStack_5a78;
                      auVar37._12_4_ = fStack_5a74;
                      auVar37._16_4_ = fStack_5a70;
                      auVar37._20_4_ = fStack_5a6c;
                      auVar37._24_4_ = fStack_5a68;
                      auVar37._28_4_ = uStack_5a64;
                      uVar59 = *(undefined4 *)(root.ptr + 0x80 + uVar58 * 4);
                      auVar130._4_4_ = uVar59;
                      auVar130._0_4_ = uVar59;
                      auVar130._8_4_ = uVar59;
                      auVar130._12_4_ = uVar59;
                      auVar130._16_4_ = uVar59;
                      auVar130._20_4_ = uVar59;
                      auVar130._24_4_ = uVar59;
                      auVar130._28_4_ = uVar59;
                      uVar59 = *(undefined4 *)(root.ptr + 0xc0 + uVar58 * 4);
                      auVar134._4_4_ = uVar59;
                      auVar134._0_4_ = uVar59;
                      auVar134._8_4_ = uVar59;
                      auVar134._12_4_ = uVar59;
                      auVar134._16_4_ = uVar59;
                      auVar134._20_4_ = uVar59;
                      auVar134._24_4_ = uVar59;
                      auVar134._28_4_ = uVar59;
                      auVar65 = vfmsub132ps_fma(auVar130,auVar37,local_5ae0);
                      auVar64 = vfmsub132ps_fma(auVar134,local_5a60,local_5ac0);
                      uVar59 = *(undefined4 *)(root.ptr + 0x60 + uVar58 * 4);
                      auVar21._4_4_ = uVar59;
                      auVar21._0_4_ = uVar59;
                      auVar21._8_4_ = uVar59;
                      auVar21._12_4_ = uVar59;
                      auVar21._16_4_ = uVar59;
                      auVar21._20_4_ = uVar59;
                      auVar21._24_4_ = uVar59;
                      auVar21._28_4_ = uVar59;
                      auVar69 = vfmsub132ps_avx512vl(local_5b00,auVar36,auVar21);
                      uVar59 = *(undefined4 *)(root.ptr + 0xa0 + uVar58 * 4);
                      auVar22._4_4_ = uVar59;
                      auVar22._0_4_ = uVar59;
                      auVar22._8_4_ = uVar59;
                      auVar22._12_4_ = uVar59;
                      auVar22._16_4_ = uVar59;
                      auVar22._20_4_ = uVar59;
                      auVar22._24_4_ = uVar59;
                      auVar22._28_4_ = uVar59;
                      auVar66 = vfmsub132ps_avx512vl(local_5ae0,auVar37,auVar22);
                      uVar59 = *(undefined4 *)(root.ptr + 0xe0 + uVar58 * 4);
                      auVar23._4_4_ = uVar59;
                      auVar23._0_4_ = uVar59;
                      auVar23._8_4_ = uVar59;
                      auVar23._12_4_ = uVar59;
                      auVar23._16_4_ = uVar59;
                      auVar23._20_4_ = uVar59;
                      auVar23._24_4_ = uVar59;
                      auVar23._28_4_ = uVar59;
                      auVar70 = vfmsub132ps_avx512vl(local_5ac0,local_5a60,auVar23);
                      auVar68 = vpminsd_avx2(ZEXT1632(auVar62),auVar69);
                      auVar67 = vpminsd_avx2(ZEXT1632(auVar65),auVar66);
                      auVar68 = vpmaxsd_avx2(auVar68,auVar67);
                      auVar67 = vpminsd_avx2(ZEXT1632(auVar64),auVar70);
                      auVar68 = vpmaxsd_avx2(auVar68,auVar67);
                      auVar67 = vpmaxsd_avx2(ZEXT1632(auVar62),auVar69);
                      auVar69 = vpmaxsd_avx2(ZEXT1632(auVar65),auVar66);
                      auVar69 = vpminsd_avx2(auVar67,auVar69);
                      auVar67 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar70);
                      auVar69 = vpminsd_avx2(auVar69,auVar67);
                      auVar67 = vpmaxsd_avx2(auVar68,local_59e0);
                      auVar69 = vpminsd_avx2(auVar69,local_59c0);
                      uVar20 = vpcmpd_avx512vl(auVar67,auVar69,2);
                      if ((byte)uVar20 != 0) {
                        auVar67 = vblendmps_avx512vl(auVar154._0_32_,auVar68);
                        bVar60 = (bool)((byte)uVar20 & 1);
                        bVar11 = (bool)((byte)(uVar20 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar20 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar20 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar20 >> 6) & 1);
                        bVar17 = SUB81(uVar20 >> 7,0);
                        if (uVar52 != 8) {
                          *puVar54 = uVar52;
                          puVar54 = puVar54 + 1;
                          *pauVar57 = auVar138._0_32_;
                          pauVar57 = pauVar57 + 1;
                        }
                        auVar138 = ZEXT3264(CONCAT428((uint)bVar17 * auVar67._28_4_ |
                                                      (uint)!bVar17 * auVar68._28_4_,
                                                      CONCAT424((uint)bVar16 * auVar67._24_4_ |
                                                                (uint)!bVar16 * auVar68._24_4_,
                                                                CONCAT420((uint)bVar15 *
                                                                          auVar67._20_4_ |
                                                                          (uint)!bVar15 *
                                                                          auVar68._20_4_,
                                                                          CONCAT416((uint)bVar14 *
                                                                                    auVar67._16_4_ |
                                                                                    (uint)!bVar14 *
                                                                                    auVar68._16_4_,
                                                                                    CONCAT412((uint)
                                                  bVar13 * auVar67._12_4_ |
                                                  (uint)!bVar13 * auVar68._12_4_,
                                                  CONCAT48((uint)bVar12 * auVar67._8_4_ |
                                                           (uint)!bVar12 * auVar68._8_4_,
                                                           CONCAT44((uint)bVar11 * auVar67._4_4_ |
                                                                    (uint)!bVar11 * auVar68._4_4_,
                                                                    (uint)bVar60 * auVar67._0_4_ |
                                                                    (uint)!bVar60 * auVar68._0_4_)))
                                                  )))));
                        uVar52 = uVar46;
                      }
                    }
                  } while ((uVar46 != 8) && (bVar60 = uVar58 < 7, uVar58 = uVar58 + 1, bVar60));
                  iVar45 = 0;
                  if (uVar52 == 8) {
LAB_0088b0be:
                    bVar60 = false;
                    iVar45 = 4;
                  }
                  else {
                    uVar18 = vcmpps_avx512vl(auVar138._0_32_,local_59c0,9);
                    bVar60 = true;
                    if ((uint)POPCOUNT((int)uVar18) <= (uint)uVar61) {
                      *puVar54 = uVar52;
                      puVar54 = puVar54 + 1;
                      *pauVar57 = auVar138._0_32_;
                      pauVar57 = pauVar57 + 1;
                      goto LAB_0088b0be;
                    }
                  }
                  root.ptr = uVar52;
                } while (bVar60);
              }
            }
          }
        } while (iVar45 != 3);
        bVar43 = bVar43 & (byte)local_5f84;
        bVar60 = (bool)(bVar43 >> 1 & 1);
        bVar11 = (bool)(bVar43 >> 2 & 1);
        bVar12 = (bool)(bVar43 >> 3 & 1);
        bVar13 = (bool)(bVar43 >> 4 & 1);
        bVar14 = (bool)(bVar43 >> 5 & 1);
        bVar15 = (bool)(bVar43 >> 6 & 1);
        *(uint *)local_5f98 =
             (uint)(bVar43 & 1) * -0x800000 | (uint)!(bool)(bVar43 & 1) * *(int *)local_5f98;
        *(uint *)(local_5f98 + 4) =
             (uint)bVar60 * -0x800000 | (uint)!bVar60 * *(int *)(local_5f98 + 4);
        *(uint *)(local_5f98 + 8) =
             (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_5f98 + 8);
        *(uint *)(local_5f98 + 0xc) =
             (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_5f98 + 0xc);
        *(uint *)(local_5f98 + 0x10) =
             (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_5f98 + 0x10);
        *(uint *)(local_5f98 + 0x14) =
             (uint)bVar14 * -0x800000 | (uint)!bVar14 * *(int *)(local_5f98 + 0x14);
        *(uint *)(local_5f98 + 0x18) =
             (uint)bVar15 * -0x800000 | (uint)!bVar15 * *(int *)(local_5f98 + 0x18);
        *(uint *)(local_5f98 + 0x1c) =
             (uint)(bVar43 >> 7) * -0x800000 |
             (uint)!(bool)(bVar43 >> 7) * *(int *)(local_5f98 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }